

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::sse2::CurveNiMBIntersectorK<4,4>::
     occluded_t<embree::sse2::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,4>,embree::sse2::Occluded1KEpilogMU<4,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  Primitive *pPVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  Primitive PVar16;
  int iVar17;
  Geometry *pGVar18;
  __int_type_conflict _Var19;
  long lVar20;
  long lVar21;
  undefined1 auVar22 [16];
  undefined8 uVar23;
  undefined8 uVar24;
  undefined6 uVar25;
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  bool bVar47;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  int iVar51;
  ulong uVar52;
  RTCFilterFunctionN p_Var53;
  RTCRayN *pRVar54;
  undefined4 uVar55;
  RTCIntersectArguments *pRVar56;
  undefined1 *puVar57;
  ulong uVar58;
  Geometry *pGVar59;
  Geometry *geometry;
  long lVar60;
  ulong uVar61;
  ulong uVar62;
  bool bVar63;
  uint uVar64;
  uint uVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  short sVar70;
  undefined2 uVar104;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar105;
  float fVar108;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar84 [16];
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar106;
  float fVar107;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar113;
  float fVar114;
  float fVar134;
  float fVar136;
  vfloat4 v_2;
  undefined1 auVar115 [16];
  undefined1 auVar118 [16];
  undefined1 auVar121 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar135;
  float fVar137;
  float fVar138;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar139;
  float fVar145;
  float fVar146;
  vfloat4 v;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar147;
  float fVar148;
  float fVar158;
  float fVar160;
  vfloat4 v_1;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar153 [16];
  float fVar159;
  float fVar161;
  float fVar162;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar177;
  float fVar181;
  undefined1 auVar167 [16];
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar188;
  float fVar189;
  float fVar211;
  float fVar213;
  undefined1 auVar190 [16];
  undefined1 auVar193 [16];
  undefined1 auVar196 [16];
  undefined1 auVar199 [16];
  undefined1 auVar202 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar212;
  float fVar214;
  float fVar215;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar216;
  float fVar217;
  float fVar221;
  float fVar223;
  undefined1 auVar218 [16];
  float fVar222;
  float fVar224;
  float fVar225;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar226;
  float fVar234;
  float fVar235;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar236;
  float fVar238;
  float fVar239;
  undefined1 auVar237 [16];
  float fVar240;
  float fVar247;
  float fVar248;
  undefined1 auVar241 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  float fVar249;
  float fVar250;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  undefined1 auVar251 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar261;
  float fVar262;
  float fVar269;
  float fVar270;
  float fVar271;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  float fVar272;
  float fVar281;
  float fVar282;
  float fVar283;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  float fVar284;
  float fVar285;
  float fVar291;
  float fVar292;
  float fVar293;
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  float fVar294;
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  float fVar295;
  float fVar299;
  float fVar300;
  float fVar301;
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  float fVar307;
  float fVar308;
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_4> bhit;
  bool local_4f9;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  ulong local_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  undefined8 *local_318;
  Precalculations *local_310;
  RTCFilterFunctionNArguments local_308;
  undefined1 local_2d8 [16];
  undefined8 local_2c8;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  LinearSpace3fa *local_238;
  Primitive *local_230;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  uint local_1f8;
  int local_1f4;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined1 local_1a8 [16];
  float local_198 [4];
  undefined8 local_188;
  undefined8 uStack_180;
  float local_178 [4];
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 uVar103;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  
  PVar16 = prim[1];
  uVar52 = (ulong)(byte)PVar16;
  lVar21 = uVar52 * 0x25;
  pPVar7 = prim + lVar21 + 6;
  fVar146 = *(float *)(pPVar7 + 0xc);
  fVar147 = (*(float *)(ray + k * 4) - *(float *)pPVar7) * fVar146;
  fVar158 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar7 + 4)) * fVar146;
  fVar160 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar7 + 8)) * fVar146;
  fVar139 = *(float *)(ray + k * 4 + 0x40) * fVar146;
  fVar145 = *(float *)(ray + k * 4 + 0x50) * fVar146;
  fVar146 = *(float *)(ray + k * 4 + 0x60) * fVar146;
  uVar55 = *(undefined4 *)(prim + uVar52 * 4 + 6);
  uVar103 = (undefined1)((uint)uVar55 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar55 >> 0x10);
  uVar23 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar55));
  uVar103 = (undefined1)((uint)uVar55 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar23 >> 0x20),uVar103),uVar103);
  sVar70 = CONCAT11((char)uVar55,(char)uVar55);
  uVar62 = CONCAT62(uVar25,sVar70);
  auVar245._8_4_ = 0;
  auVar245._0_8_ = uVar62;
  auVar245._12_2_ = uVar104;
  auVar245._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar23 >> 0x20);
  auVar141._12_4_ = auVar245._12_4_;
  auVar141._8_2_ = 0;
  auVar141._0_8_ = uVar62;
  auVar141._10_2_ = uVar104;
  auVar74._10_6_ = auVar141._10_6_;
  auVar74._8_2_ = uVar104;
  auVar74._0_8_ = uVar62;
  uVar104 = (undefined2)uVar25;
  auVar26._4_8_ = auVar74._8_8_;
  auVar26._2_2_ = uVar104;
  auVar26._0_2_ = uVar104;
  fVar284 = (float)((int)sVar70 >> 8);
  fVar291 = (float)(auVar26._0_4_ >> 0x18);
  fVar292 = (float)(auVar74._8_4_ >> 0x18);
  uVar55 = *(undefined4 *)(prim + uVar52 * 5 + 6);
  uVar103 = (undefined1)((uint)uVar55 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar55 >> 0x10);
  uVar23 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar55));
  uVar103 = (undefined1)((uint)uVar55 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar23 >> 0x20),uVar103),uVar103);
  sVar70 = CONCAT11((char)uVar55,(char)uVar55);
  uVar62 = CONCAT62(uVar25,sVar70);
  auVar117._8_4_ = 0;
  auVar117._0_8_ = uVar62;
  auVar117._12_2_ = uVar104;
  auVar117._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar23 >> 0x20);
  auVar116._12_4_ = auVar117._12_4_;
  auVar116._8_2_ = 0;
  auVar116._0_8_ = uVar62;
  auVar116._10_2_ = uVar104;
  auVar115._10_6_ = auVar116._10_6_;
  auVar115._8_2_ = uVar104;
  auVar115._0_8_ = uVar62;
  uVar104 = (undefined2)uVar25;
  auVar27._4_8_ = auVar115._8_8_;
  auVar27._2_2_ = uVar104;
  auVar27._0_2_ = uVar104;
  fVar163 = (float)((int)sVar70 >> 8);
  fVar177 = (float)(auVar27._0_4_ >> 0x18);
  fVar181 = (float)(auVar115._8_4_ >> 0x18);
  uVar55 = *(undefined4 *)(prim + uVar52 * 6 + 6);
  uVar103 = (undefined1)((uint)uVar55 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar55 >> 0x10);
  uVar23 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar55));
  uVar103 = (undefined1)((uint)uVar55 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar23 >> 0x20),uVar103),uVar103);
  sVar70 = CONCAT11((char)uVar55,(char)uVar55);
  uVar62 = CONCAT62(uVar25,sVar70);
  auVar120._8_4_ = 0;
  auVar120._0_8_ = uVar62;
  auVar120._12_2_ = uVar104;
  auVar120._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar23 >> 0x20);
  auVar119._12_4_ = auVar120._12_4_;
  auVar119._8_2_ = 0;
  auVar119._0_8_ = uVar62;
  auVar119._10_2_ = uVar104;
  auVar118._10_6_ = auVar119._10_6_;
  auVar118._8_2_ = uVar104;
  auVar118._0_8_ = uVar62;
  uVar104 = (undefined2)uVar25;
  auVar28._4_8_ = auVar118._8_8_;
  auVar28._2_2_ = uVar104;
  auVar28._0_2_ = uVar104;
  fVar216 = (float)((int)sVar70 >> 8);
  fVar221 = (float)(auVar28._0_4_ >> 0x18);
  fVar223 = (float)(auVar118._8_4_ >> 0x18);
  uVar55 = *(undefined4 *)(prim + uVar52 * 0xf + 6);
  uVar103 = (undefined1)((uint)uVar55 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar55 >> 0x10);
  uVar23 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar55));
  uVar103 = (undefined1)((uint)uVar55 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar23 >> 0x20),uVar103),uVar103);
  sVar70 = CONCAT11((char)uVar55,(char)uVar55);
  uVar62 = CONCAT62(uVar25,sVar70);
  auVar123._8_4_ = 0;
  auVar123._0_8_ = uVar62;
  auVar123._12_2_ = uVar104;
  auVar123._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar23 >> 0x20);
  auVar122._12_4_ = auVar123._12_4_;
  auVar122._8_2_ = 0;
  auVar122._0_8_ = uVar62;
  auVar122._10_2_ = uVar104;
  auVar121._10_6_ = auVar122._10_6_;
  auVar121._8_2_ = uVar104;
  auVar121._0_8_ = uVar62;
  uVar104 = (undefined2)uVar25;
  auVar29._4_8_ = auVar121._8_8_;
  auVar29._2_2_ = uVar104;
  auVar29._0_2_ = uVar104;
  fVar71 = (float)((int)sVar70 >> 8);
  fVar105 = (float)(auVar29._0_4_ >> 0x18);
  fVar108 = (float)(auVar121._8_4_ >> 0x18);
  uVar55 = *(undefined4 *)(prim + (ulong)(byte)PVar16 * 0x10 + 6);
  uVar103 = (undefined1)((uint)uVar55 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar55 >> 0x10);
  uVar23 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar55));
  uVar103 = (undefined1)((uint)uVar55 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar23 >> 0x20),uVar103),uVar103);
  sVar70 = CONCAT11((char)uVar55,(char)uVar55);
  uVar62 = CONCAT62(uVar25,sVar70);
  auVar192._8_4_ = 0;
  auVar192._0_8_ = uVar62;
  auVar192._12_2_ = uVar104;
  auVar192._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar23 >> 0x20);
  auVar191._12_4_ = auVar192._12_4_;
  auVar191._8_2_ = 0;
  auVar191._0_8_ = uVar62;
  auVar191._10_2_ = uVar104;
  auVar190._10_6_ = auVar191._10_6_;
  auVar190._8_2_ = uVar104;
  auVar190._0_8_ = uVar62;
  uVar104 = (undefined2)uVar25;
  auVar30._4_8_ = auVar190._8_8_;
  auVar30._2_2_ = uVar104;
  auVar30._0_2_ = uVar104;
  fVar226 = (float)((int)sVar70 >> 8);
  fVar234 = (float)(auVar30._0_4_ >> 0x18);
  fVar235 = (float)(auVar190._8_4_ >> 0x18);
  uVar55 = *(undefined4 *)(prim + (ulong)(byte)PVar16 * 0x10 + uVar52 + 6);
  uVar103 = (undefined1)((uint)uVar55 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar55 >> 0x10);
  uVar23 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar55));
  uVar103 = (undefined1)((uint)uVar55 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar23 >> 0x20),uVar103),uVar103);
  sVar70 = CONCAT11((char)uVar55,(char)uVar55);
  uVar62 = CONCAT62(uVar25,sVar70);
  auVar195._8_4_ = 0;
  auVar195._0_8_ = uVar62;
  auVar195._12_2_ = uVar104;
  auVar195._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar23 >> 0x20);
  auVar194._12_4_ = auVar195._12_4_;
  auVar194._8_2_ = 0;
  auVar194._0_8_ = uVar62;
  auVar194._10_2_ = uVar104;
  auVar193._10_6_ = auVar194._10_6_;
  auVar193._8_2_ = uVar104;
  auVar193._0_8_ = uVar62;
  uVar104 = (undefined2)uVar25;
  auVar31._4_8_ = auVar193._8_8_;
  auVar31._2_2_ = uVar104;
  auVar31._0_2_ = uVar104;
  fVar240 = (float)((int)sVar70 >> 8);
  fVar247 = (float)(auVar31._0_4_ >> 0x18);
  fVar248 = (float)(auVar193._8_4_ >> 0x18);
  uVar55 = *(undefined4 *)(prim + uVar52 * 0x1a + 6);
  uVar103 = (undefined1)((uint)uVar55 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar55 >> 0x10);
  uVar23 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar55));
  uVar103 = (undefined1)((uint)uVar55 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar23 >> 0x20),uVar103),uVar103);
  sVar70 = CONCAT11((char)uVar55,(char)uVar55);
  uVar62 = CONCAT62(uVar25,sVar70);
  auVar198._8_4_ = 0;
  auVar198._0_8_ = uVar62;
  auVar198._12_2_ = uVar104;
  auVar198._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar23 >> 0x20);
  auVar197._12_4_ = auVar198._12_4_;
  auVar197._8_2_ = 0;
  auVar197._0_8_ = uVar62;
  auVar197._10_2_ = uVar104;
  auVar196._10_6_ = auVar197._10_6_;
  auVar196._8_2_ = uVar104;
  auVar196._0_8_ = uVar62;
  uVar104 = (undefined2)uVar25;
  auVar32._4_8_ = auVar196._8_8_;
  auVar32._2_2_ = uVar104;
  auVar32._0_2_ = uVar104;
  fVar236 = (float)((int)sVar70 >> 8);
  fVar238 = (float)(auVar32._0_4_ >> 0x18);
  fVar239 = (float)(auVar196._8_4_ >> 0x18);
  uVar55 = *(undefined4 *)(prim + uVar52 * 0x1b + 6);
  uVar103 = (undefined1)((uint)uVar55 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar55 >> 0x10);
  uVar23 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar55));
  uVar103 = (undefined1)((uint)uVar55 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar23 >> 0x20),uVar103),uVar103);
  sVar70 = CONCAT11((char)uVar55,(char)uVar55);
  uVar62 = CONCAT62(uVar25,sVar70);
  auVar201._8_4_ = 0;
  auVar201._0_8_ = uVar62;
  auVar201._12_2_ = uVar104;
  auVar201._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar23 >> 0x20);
  auVar200._12_4_ = auVar201._12_4_;
  auVar200._8_2_ = 0;
  auVar200._0_8_ = uVar62;
  auVar200._10_2_ = uVar104;
  auVar199._10_6_ = auVar200._10_6_;
  auVar199._8_2_ = uVar104;
  auVar199._0_8_ = uVar62;
  uVar104 = (undefined2)uVar25;
  auVar33._4_8_ = auVar199._8_8_;
  auVar33._2_2_ = uVar104;
  auVar33._0_2_ = uVar104;
  fVar249 = (float)((int)sVar70 >> 8);
  fVar257 = (float)(auVar33._0_4_ >> 0x18);
  fVar259 = (float)(auVar199._8_4_ >> 0x18);
  uVar55 = *(undefined4 *)(prim + uVar52 * 0x1c + 6);
  uVar103 = (undefined1)((uint)uVar55 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar55 >> 0x10);
  uVar23 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar55));
  uVar103 = (undefined1)((uint)uVar55 >> 8);
  uVar25 = CONCAT51(CONCAT41((int)((ulong)uVar23 >> 0x20),uVar103),uVar103);
  sVar70 = CONCAT11((char)uVar55,(char)uVar55);
  uVar62 = CONCAT62(uVar25,sVar70);
  auVar204._8_4_ = 0;
  auVar204._0_8_ = uVar62;
  auVar204._12_2_ = uVar104;
  auVar204._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar23 >> 0x20);
  auVar203._12_4_ = auVar204._12_4_;
  auVar203._8_2_ = 0;
  auVar203._0_8_ = uVar62;
  auVar203._10_2_ = uVar104;
  auVar202._10_6_ = auVar203._10_6_;
  auVar202._8_2_ = uVar104;
  auVar202._0_8_ = uVar62;
  uVar104 = (undefined2)uVar25;
  auVar34._4_8_ = auVar202._8_8_;
  auVar34._2_2_ = uVar104;
  auVar34._0_2_ = uVar104;
  fVar113 = (float)((int)sVar70 >> 8);
  fVar134 = (float)(auVar34._0_4_ >> 0x18);
  fVar136 = (float)(auVar202._8_4_ >> 0x18);
  fVar272 = fVar139 * fVar284 + fVar145 * fVar163 + fVar146 * fVar216;
  fVar281 = fVar139 * fVar291 + fVar145 * fVar177 + fVar146 * fVar221;
  fVar282 = fVar139 * fVar292 + fVar145 * fVar181 + fVar146 * fVar223;
  fVar283 = fVar139 * (float)(auVar141._12_4_ >> 0x18) +
            fVar145 * (float)(auVar116._12_4_ >> 0x18) + fVar146 * (float)(auVar119._12_4_ >> 0x18);
  fVar262 = fVar139 * fVar71 + fVar145 * fVar226 + fVar146 * fVar240;
  fVar269 = fVar139 * fVar105 + fVar145 * fVar234 + fVar146 * fVar247;
  fVar270 = fVar139 * fVar108 + fVar145 * fVar235 + fVar146 * fVar248;
  fVar271 = fVar139 * (float)(auVar122._12_4_ >> 0x18) +
            fVar145 * (float)(auVar191._12_4_ >> 0x18) + fVar146 * (float)(auVar194._12_4_ >> 0x18);
  fVar188 = fVar139 * fVar236 + fVar145 * fVar249 + fVar146 * fVar113;
  fVar211 = fVar139 * fVar238 + fVar145 * fVar257 + fVar146 * fVar134;
  fVar213 = fVar139 * fVar239 + fVar145 * fVar259 + fVar146 * fVar136;
  fVar139 = fVar139 * (float)(auVar197._12_4_ >> 0x18) +
            fVar145 * (float)(auVar200._12_4_ >> 0x18) + fVar146 * (float)(auVar203._12_4_ >> 0x18);
  fVar285 = fVar284 * fVar147 + fVar163 * fVar158 + fVar216 * fVar160;
  fVar291 = fVar291 * fVar147 + fVar177 * fVar158 + fVar221 * fVar160;
  fVar292 = fVar292 * fVar147 + fVar181 * fVar158 + fVar223 * fVar160;
  fVar293 = (float)(auVar141._12_4_ >> 0x18) * fVar147 +
            (float)(auVar116._12_4_ >> 0x18) * fVar158 + (float)(auVar119._12_4_ >> 0x18) * fVar160;
  fVar240 = fVar71 * fVar147 + fVar226 * fVar158 + fVar240 * fVar160;
  fVar247 = fVar105 * fVar147 + fVar234 * fVar158 + fVar247 * fVar160;
  fVar248 = fVar108 * fVar147 + fVar235 * fVar158 + fVar248 * fVar160;
  fVar284 = (float)(auVar122._12_4_ >> 0x18) * fVar147 +
            (float)(auVar191._12_4_ >> 0x18) * fVar158 + (float)(auVar194._12_4_ >> 0x18) * fVar160;
  fVar236 = fVar147 * fVar236 + fVar158 * fVar249 + fVar160 * fVar113;
  fVar238 = fVar147 * fVar238 + fVar158 * fVar257 + fVar160 * fVar134;
  fVar239 = fVar147 * fVar239 + fVar158 * fVar259 + fVar160 * fVar136;
  fVar249 = fVar147 * (float)(auVar197._12_4_ >> 0x18) +
            fVar158 * (float)(auVar200._12_4_ >> 0x18) + fVar160 * (float)(auVar203._12_4_ >> 0x18);
  fVar146 = (float)DAT_01ff1d40;
  fVar71 = DAT_01ff1d40._4_4_;
  fVar105 = DAT_01ff1d40._8_4_;
  fVar108 = DAT_01ff1d40._12_4_;
  uVar64 = -(uint)(fVar146 <= ABS(fVar272));
  uVar65 = -(uint)(fVar71 <= ABS(fVar281));
  uVar66 = -(uint)(fVar105 <= ABS(fVar282));
  uVar67 = -(uint)(fVar108 <= ABS(fVar283));
  auVar273._0_4_ = (uint)fVar272 & uVar64;
  auVar273._4_4_ = (uint)fVar281 & uVar65;
  auVar273._8_4_ = (uint)fVar282 & uVar66;
  auVar273._12_4_ = (uint)fVar283 & uVar67;
  auVar149._0_4_ = ~uVar64 & (uint)fVar146;
  auVar149._4_4_ = ~uVar65 & (uint)fVar71;
  auVar149._8_4_ = ~uVar66 & (uint)fVar105;
  auVar149._12_4_ = ~uVar67 & (uint)fVar108;
  auVar149 = auVar149 | auVar273;
  uVar64 = -(uint)(fVar146 <= ABS(fVar262));
  uVar65 = -(uint)(fVar71 <= ABS(fVar269));
  uVar66 = -(uint)(fVar105 <= ABS(fVar270));
  uVar67 = -(uint)(fVar108 <= ABS(fVar271));
  auVar263._0_4_ = (uint)fVar262 & uVar64;
  auVar263._4_4_ = (uint)fVar269 & uVar65;
  auVar263._8_4_ = (uint)fVar270 & uVar66;
  auVar263._12_4_ = (uint)fVar271 & uVar67;
  auVar218._0_4_ = ~uVar64 & (uint)fVar146;
  auVar218._4_4_ = ~uVar65 & (uint)fVar71;
  auVar218._8_4_ = ~uVar66 & (uint)fVar105;
  auVar218._12_4_ = ~uVar67 & (uint)fVar108;
  auVar218 = auVar218 | auVar263;
  uVar64 = -(uint)(fVar146 <= ABS(fVar188));
  uVar65 = -(uint)(fVar71 <= ABS(fVar211));
  uVar66 = -(uint)(fVar105 <= ABS(fVar213));
  uVar67 = -(uint)(fVar108 <= ABS(fVar139));
  auVar205._0_4_ = (uint)fVar188 & uVar64;
  auVar205._4_4_ = (uint)fVar211 & uVar65;
  auVar205._8_4_ = (uint)fVar213 & uVar66;
  auVar205._12_4_ = (uint)fVar139 & uVar67;
  auVar227._0_4_ = ~uVar64 & (uint)fVar146;
  auVar227._4_4_ = ~uVar65 & (uint)fVar71;
  auVar227._8_4_ = ~uVar66 & (uint)fVar105;
  auVar227._12_4_ = ~uVar67 & (uint)fVar108;
  auVar227 = auVar227 | auVar205;
  auVar74 = rcpps(_DAT_01ff1d40,auVar149);
  fVar146 = auVar74._0_4_;
  fVar108 = auVar74._4_4_;
  fVar163 = auVar74._8_4_;
  fVar226 = auVar74._12_4_;
  fVar146 = (1.0 - auVar149._0_4_ * fVar146) * fVar146 + fVar146;
  fVar108 = (1.0 - auVar149._4_4_ * fVar108) * fVar108 + fVar108;
  fVar163 = (1.0 - auVar149._8_4_ * fVar163) * fVar163 + fVar163;
  fVar226 = (1.0 - auVar149._12_4_ * fVar226) * fVar226 + fVar226;
  auVar74 = rcpps(auVar74,auVar218);
  fVar71 = auVar74._0_4_;
  fVar113 = auVar74._4_4_;
  fVar177 = auVar74._8_4_;
  fVar234 = auVar74._12_4_;
  fVar71 = (1.0 - auVar218._0_4_ * fVar71) * fVar71 + fVar71;
  fVar113 = (1.0 - auVar218._4_4_ * fVar113) * fVar113 + fVar113;
  fVar177 = (1.0 - auVar218._8_4_ * fVar177) * fVar177 + fVar177;
  fVar234 = (1.0 - auVar218._12_4_ * fVar234) * fVar234 + fVar234;
  auVar74 = rcpps(auVar74,auVar227);
  fVar105 = auVar74._0_4_;
  fVar134 = auVar74._4_4_;
  fVar181 = auVar74._8_4_;
  fVar235 = auVar74._12_4_;
  fVar105 = (1.0 - auVar227._0_4_ * fVar105) * fVar105 + fVar105;
  fVar134 = (1.0 - auVar227._4_4_ * fVar134) * fVar134 + fVar134;
  fVar181 = (1.0 - auVar227._8_4_ * fVar181) * fVar181 + fVar181;
  fVar235 = (1.0 - auVar227._12_4_ * fVar235) * fVar235 + fVar235;
  fVar257 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar21 + 0x16)) *
            *(float *)(prim + lVar21 + 0x1a);
  uVar62 = *(ulong *)(prim + uVar52 * 7 + 6);
  uVar104 = (undefined2)(uVar62 >> 0x30);
  auVar77._8_4_ = 0;
  auVar77._0_8_ = uVar62;
  auVar77._12_2_ = uVar104;
  auVar77._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar62 >> 0x20);
  auVar76._12_4_ = auVar77._12_4_;
  auVar76._8_2_ = 0;
  auVar76._0_8_ = uVar62;
  auVar76._10_2_ = uVar104;
  auVar75._10_6_ = auVar76._10_6_;
  auVar75._8_2_ = uVar104;
  auVar75._0_8_ = uVar62;
  uVar104 = (undefined2)(uVar62 >> 0x10);
  auVar35._4_8_ = auVar75._8_8_;
  auVar35._2_2_ = uVar104;
  auVar35._0_2_ = uVar104;
  fVar136 = (float)(auVar35._0_4_ >> 0x10);
  fVar188 = (float)(auVar75._8_4_ >> 0x10);
  uVar61 = *(ulong *)(prim + uVar52 * 0xb + 6);
  uVar104 = (undefined2)(uVar61 >> 0x30);
  auVar152._8_4_ = 0;
  auVar152._0_8_ = uVar61;
  auVar152._12_2_ = uVar104;
  auVar152._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar61 >> 0x20);
  auVar151._12_4_ = auVar152._12_4_;
  auVar151._8_2_ = 0;
  auVar151._0_8_ = uVar61;
  auVar151._10_2_ = uVar104;
  auVar150._10_6_ = auVar151._10_6_;
  auVar150._8_2_ = uVar104;
  auVar150._0_8_ = uVar61;
  uVar104 = (undefined2)(uVar61 >> 0x10);
  auVar36._4_8_ = auVar150._8_8_;
  auVar36._2_2_ = uVar104;
  auVar36._0_2_ = uVar104;
  uVar8 = *(ulong *)(prim + uVar52 * 9 + 6);
  uVar104 = (undefined2)(uVar8 >> 0x30);
  auVar80._8_4_ = 0;
  auVar80._0_8_ = uVar8;
  auVar80._12_2_ = uVar104;
  auVar80._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar8 >> 0x20);
  auVar79._12_4_ = auVar80._12_4_;
  auVar79._8_2_ = 0;
  auVar79._0_8_ = uVar8;
  auVar79._10_2_ = uVar104;
  auVar78._10_6_ = auVar79._10_6_;
  auVar78._8_2_ = uVar104;
  auVar78._0_8_ = uVar8;
  uVar104 = (undefined2)(uVar8 >> 0x10);
  auVar37._4_8_ = auVar78._8_8_;
  auVar37._2_2_ = uVar104;
  auVar37._0_2_ = uVar104;
  fVar139 = (float)(auVar37._0_4_ >> 0x10);
  fVar211 = (float)(auVar78._8_4_ >> 0x10);
  uVar9 = *(ulong *)(prim + uVar52 * 0xd + 6);
  uVar104 = (undefined2)(uVar9 >> 0x30);
  auVar230._8_4_ = 0;
  auVar230._0_8_ = uVar9;
  auVar230._12_2_ = uVar104;
  auVar230._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar9 >> 0x20);
  auVar229._12_4_ = auVar230._12_4_;
  auVar229._8_2_ = 0;
  auVar229._0_8_ = uVar9;
  auVar229._10_2_ = uVar104;
  auVar228._10_6_ = auVar229._10_6_;
  auVar228._8_2_ = uVar104;
  auVar228._0_8_ = uVar9;
  uVar104 = (undefined2)(uVar9 >> 0x10);
  auVar38._4_8_ = auVar228._8_8_;
  auVar38._2_2_ = uVar104;
  auVar38._0_2_ = uVar104;
  uVar10 = *(ulong *)(prim + uVar52 * 0x12 + 6);
  uVar104 = (undefined2)(uVar10 >> 0x30);
  auVar83._8_4_ = 0;
  auVar83._0_8_ = uVar10;
  auVar83._12_2_ = uVar104;
  auVar83._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar10 >> 0x20);
  auVar82._12_4_ = auVar83._12_4_;
  auVar82._8_2_ = 0;
  auVar82._0_8_ = uVar10;
  auVar82._10_2_ = uVar104;
  auVar81._10_6_ = auVar82._10_6_;
  auVar81._8_2_ = uVar104;
  auVar81._0_8_ = uVar10;
  uVar104 = (undefined2)(uVar10 >> 0x10);
  auVar39._4_8_ = auVar81._8_8_;
  auVar39._2_2_ = uVar104;
  auVar39._0_2_ = uVar104;
  fVar145 = (float)(auVar39._0_4_ >> 0x10);
  fVar213 = (float)(auVar81._8_4_ >> 0x10);
  uVar58 = (ulong)(uint)((int)(uVar52 * 5) << 2);
  uVar11 = *(ulong *)(prim + uVar52 * 2 + uVar58 + 6);
  uVar104 = (undefined2)(uVar11 >> 0x30);
  auVar243._8_4_ = 0;
  auVar243._0_8_ = uVar11;
  auVar243._12_2_ = uVar104;
  auVar243._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar11 >> 0x20);
  auVar242._12_4_ = auVar243._12_4_;
  auVar242._8_2_ = 0;
  auVar242._0_8_ = uVar11;
  auVar242._10_2_ = uVar104;
  auVar241._10_6_ = auVar242._10_6_;
  auVar241._8_2_ = uVar104;
  auVar241._0_8_ = uVar11;
  uVar104 = (undefined2)(uVar11 >> 0x10);
  auVar40._4_8_ = auVar241._8_8_;
  auVar40._2_2_ = uVar104;
  auVar40._0_2_ = uVar104;
  uVar58 = *(ulong *)(prim + uVar58 + 6);
  uVar104 = (undefined2)(uVar58 >> 0x30);
  auVar86._8_4_ = 0;
  auVar86._0_8_ = uVar58;
  auVar86._12_2_ = uVar104;
  auVar86._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar58 >> 0x20);
  auVar85._12_4_ = auVar86._12_4_;
  auVar85._8_2_ = 0;
  auVar85._0_8_ = uVar58;
  auVar85._10_2_ = uVar104;
  auVar84._10_6_ = auVar85._10_6_;
  auVar84._8_2_ = uVar104;
  auVar84._0_8_ = uVar58;
  uVar104 = (undefined2)(uVar58 >> 0x10);
  auVar41._4_8_ = auVar84._8_8_;
  auVar41._2_2_ = uVar104;
  auVar41._0_2_ = uVar104;
  fVar147 = (float)(auVar41._0_4_ >> 0x10);
  fVar216 = (float)(auVar84._8_4_ >> 0x10);
  uVar12 = *(ulong *)(prim + uVar52 * 0x18 + 6);
  uVar104 = (undefined2)(uVar12 >> 0x30);
  auVar253._8_4_ = 0;
  auVar253._0_8_ = uVar12;
  auVar253._12_2_ = uVar104;
  auVar253._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar12 >> 0x20);
  auVar252._12_4_ = auVar253._12_4_;
  auVar252._8_2_ = 0;
  auVar252._0_8_ = uVar12;
  auVar252._10_2_ = uVar104;
  auVar251._10_6_ = auVar252._10_6_;
  auVar251._8_2_ = uVar104;
  auVar251._0_8_ = uVar12;
  uVar104 = (undefined2)(uVar12 >> 0x10);
  auVar42._4_8_ = auVar251._8_8_;
  auVar42._2_2_ = uVar104;
  auVar42._0_2_ = uVar104;
  uVar13 = *(ulong *)(prim + uVar52 * 0x1d + 6);
  uVar104 = (undefined2)(uVar13 >> 0x30);
  auVar89._8_4_ = 0;
  auVar89._0_8_ = uVar13;
  auVar89._12_2_ = uVar104;
  auVar89._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar13 >> 0x20);
  auVar88._12_4_ = auVar89._12_4_;
  auVar88._8_2_ = 0;
  auVar88._0_8_ = uVar13;
  auVar88._10_2_ = uVar104;
  auVar87._10_6_ = auVar88._10_6_;
  auVar87._8_2_ = uVar104;
  auVar87._0_8_ = uVar13;
  uVar104 = (undefined2)(uVar13 >> 0x10);
  auVar43._4_8_ = auVar87._8_8_;
  auVar43._2_2_ = uVar104;
  auVar43._0_2_ = uVar104;
  fVar158 = (float)(auVar43._0_4_ >> 0x10);
  fVar221 = (float)(auVar87._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar52 + (ulong)(byte)PVar16 * 0x20 + 6);
  uVar104 = (undefined2)(uVar14 >> 0x30);
  auVar266._8_4_ = 0;
  auVar266._0_8_ = uVar14;
  auVar266._12_2_ = uVar104;
  auVar266._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar14 >> 0x20);
  auVar265._12_4_ = auVar266._12_4_;
  auVar265._8_2_ = 0;
  auVar265._0_8_ = uVar14;
  auVar265._10_2_ = uVar104;
  auVar264._10_6_ = auVar265._10_6_;
  auVar264._8_2_ = uVar104;
  auVar264._0_8_ = uVar14;
  uVar104 = (undefined2)(uVar14 >> 0x10);
  auVar44._4_8_ = auVar264._8_8_;
  auVar44._2_2_ = uVar104;
  auVar44._0_2_ = uVar104;
  uVar15 = *(ulong *)(prim + ((ulong)(byte)PVar16 * 0x20 - uVar52) + 6);
  uVar104 = (undefined2)(uVar15 >> 0x30);
  auVar92._8_4_ = 0;
  auVar92._0_8_ = uVar15;
  auVar92._12_2_ = uVar104;
  auVar92._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar15 >> 0x20);
  auVar91._12_4_ = auVar92._12_4_;
  auVar91._8_2_ = 0;
  auVar91._0_8_ = uVar15;
  auVar91._10_2_ = uVar104;
  auVar90._10_6_ = auVar91._10_6_;
  auVar90._8_2_ = uVar104;
  auVar90._0_8_ = uVar15;
  uVar104 = (undefined2)(uVar15 >> 0x10);
  auVar45._4_8_ = auVar90._8_8_;
  auVar45._2_2_ = uVar104;
  auVar45._0_2_ = uVar104;
  fVar160 = (float)(auVar45._0_4_ >> 0x10);
  fVar223 = (float)(auVar90._8_4_ >> 0x10);
  uVar52 = *(ulong *)(prim + uVar52 * 0x23 + 6);
  uVar104 = (undefined2)(uVar52 >> 0x30);
  auVar276._8_4_ = 0;
  auVar276._0_8_ = uVar52;
  auVar276._12_2_ = uVar104;
  auVar276._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar52 >> 0x20);
  auVar275._12_4_ = auVar276._12_4_;
  auVar275._8_2_ = 0;
  auVar275._0_8_ = uVar52;
  auVar275._10_2_ = uVar104;
  auVar274._10_6_ = auVar275._10_6_;
  auVar274._8_2_ = uVar104;
  auVar274._0_8_ = uVar52;
  uVar104 = (undefined2)(uVar52 >> 0x10);
  auVar46._4_8_ = auVar274._8_8_;
  auVar46._2_2_ = uVar104;
  auVar46._0_2_ = uVar104;
  auVar153._0_8_ =
       CONCAT44(((((float)(auVar36._0_4_ >> 0x10) - fVar136) * fVar257 + fVar136) - fVar291) *
                fVar108,((((float)(int)(short)uVar61 - (float)(int)(short)uVar62) * fVar257 +
                         (float)(int)(short)uVar62) - fVar285) * fVar146);
  auVar153._8_4_ =
       ((((float)(auVar150._8_4_ >> 0x10) - fVar188) * fVar257 + fVar188) - fVar292) * fVar163;
  auVar153._12_4_ =
       ((((float)(auVar151._12_4_ >> 0x10) - (float)(auVar76._12_4_ >> 0x10)) * fVar257 +
        (float)(auVar76._12_4_ >> 0x10)) - fVar293) * fVar226;
  auVar231._0_4_ =
       ((((float)(int)(short)uVar9 - (float)(int)(short)uVar8) * fVar257 + (float)(int)(short)uVar8)
       - fVar285) * fVar146;
  auVar231._4_4_ =
       ((((float)(auVar38._0_4_ >> 0x10) - fVar139) * fVar257 + fVar139) - fVar291) * fVar108;
  auVar231._8_4_ =
       ((((float)(auVar228._8_4_ >> 0x10) - fVar211) * fVar257 + fVar211) - fVar292) * fVar163;
  auVar231._12_4_ =
       ((((float)(auVar229._12_4_ >> 0x10) - (float)(auVar79._12_4_ >> 0x10)) * fVar257 +
        (float)(auVar79._12_4_ >> 0x10)) - fVar293) * fVar226;
  auVar244._0_8_ =
       CONCAT44(((((float)(auVar40._0_4_ >> 0x10) - fVar145) * fVar257 + fVar145) - fVar247) *
                fVar113,((((float)(int)(short)uVar11 - (float)(int)(short)uVar10) * fVar257 +
                         (float)(int)(short)uVar10) - fVar240) * fVar71);
  auVar244._8_4_ =
       ((((float)(auVar241._8_4_ >> 0x10) - fVar213) * fVar257 + fVar213) - fVar248) * fVar177;
  auVar244._12_4_ =
       ((((float)(auVar242._12_4_ >> 0x10) - (float)(auVar82._12_4_ >> 0x10)) * fVar257 +
        (float)(auVar82._12_4_ >> 0x10)) - fVar284) * fVar234;
  auVar254._0_4_ =
       ((((float)(int)(short)uVar12 - (float)(int)(short)uVar58) * fVar257 +
        (float)(int)(short)uVar58) - fVar240) * fVar71;
  auVar254._4_4_ =
       ((((float)(auVar42._0_4_ >> 0x10) - fVar147) * fVar257 + fVar147) - fVar247) * fVar113;
  auVar254._8_4_ =
       ((((float)(auVar251._8_4_ >> 0x10) - fVar216) * fVar257 + fVar216) - fVar248) * fVar177;
  auVar254._12_4_ =
       ((((float)(auVar252._12_4_ >> 0x10) - (float)(auVar85._12_4_ >> 0x10)) * fVar257 +
        (float)(auVar85._12_4_ >> 0x10)) - fVar284) * fVar234;
  uVar55 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar267._0_8_ =
       CONCAT44(((((float)(auVar44._0_4_ >> 0x10) - fVar158) * fVar257 + fVar158) - fVar238) *
                fVar134,((((float)(int)(short)uVar14 - (float)(int)(short)uVar13) * fVar257 +
                         (float)(int)(short)uVar13) - fVar236) * fVar105);
  auVar267._8_4_ =
       ((((float)(auVar264._8_4_ >> 0x10) - fVar221) * fVar257 + fVar221) - fVar239) * fVar181;
  auVar267._12_4_ =
       ((((float)(auVar265._12_4_ >> 0x10) - (float)(auVar88._12_4_ >> 0x10)) * fVar257 +
        (float)(auVar88._12_4_ >> 0x10)) - fVar249) * fVar235;
  auVar277._0_4_ =
       ((((float)(int)(short)uVar52 - (float)(int)(short)uVar15) * fVar257 +
        (float)(int)(short)uVar15) - fVar236) * fVar105;
  auVar277._4_4_ =
       ((((float)(auVar46._0_4_ >> 0x10) - fVar160) * fVar257 + fVar160) - fVar238) * fVar134;
  auVar277._8_4_ =
       ((((float)(auVar274._8_4_ >> 0x10) - fVar223) * fVar257 + fVar223) - fVar239) * fVar181;
  auVar277._12_4_ =
       ((((float)(auVar275._12_4_ >> 0x10) - (float)(auVar91._12_4_ >> 0x10)) * fVar257 +
        (float)(auVar91._12_4_ >> 0x10)) - fVar249) * fVar235;
  auVar140._8_4_ = auVar153._8_4_;
  auVar140._0_8_ = auVar153._0_8_;
  auVar140._12_4_ = auVar153._12_4_;
  auVar141 = minps(auVar140,auVar231);
  auVar124._8_4_ = auVar244._8_4_;
  auVar124._0_8_ = auVar244._0_8_;
  auVar124._12_4_ = auVar244._12_4_;
  auVar74 = minps(auVar124,auVar254);
  auVar141 = maxps(auVar141,auVar74);
  auVar125._8_4_ = auVar267._8_4_;
  auVar125._0_8_ = auVar267._0_8_;
  auVar125._12_4_ = auVar267._12_4_;
  auVar74 = minps(auVar125,auVar277);
  auVar93._4_4_ = uVar55;
  auVar93._0_4_ = uVar55;
  auVar93._8_4_ = uVar55;
  auVar93._12_4_ = uVar55;
  auVar74 = maxps(auVar74,auVar93);
  auVar74 = maxps(auVar141,auVar74);
  auVar141 = maxps(auVar153,auVar231);
  auVar245 = maxps(auVar244,auVar254);
  auVar141 = minps(auVar141,auVar245);
  auVar245 = maxps(auVar267,auVar277);
  uVar55 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar94._4_4_ = uVar55;
  auVar94._0_4_ = uVar55;
  auVar94._8_4_ = uVar55;
  auVar94._12_4_ = uVar55;
  auVar245 = minps(auVar245,auVar94);
  local_48 = auVar74._0_4_ * 0.99999964;
  fStack_44 = auVar74._4_4_ * 0.99999964;
  fStack_40 = auVar74._8_4_ * 0.99999964;
  fStack_3c = auVar74._12_4_ * 0.99999964;
  auVar74 = minps(auVar141,auVar245);
  uVar64 = (uint)(byte)PVar16;
  auVar95._0_4_ = -(uint)(local_48 <= auVar74._0_4_ * 1.0000004 && uVar64 != 0);
  auVar95._4_4_ = -(uint)(fStack_44 <= auVar74._4_4_ * 1.0000004 && 1 < uVar64);
  auVar95._8_4_ = -(uint)(fStack_40 <= auVar74._8_4_ * 1.0000004 && 2 < uVar64);
  auVar95._12_4_ = -(uint)(fStack_3c <= auVar74._12_4_ * 1.0000004 && 3 < uVar64);
  uVar64 = movmskps(uVar64,auVar95);
  local_4f9 = uVar64 != 0;
  if (local_4f9) {
    uVar64 = uVar64 & 0xff;
    local_238 = pre->ray_space + k;
    local_398 = mm_lookupmask_ps._0_8_;
    uStack_390 = mm_lookupmask_ps._8_8_;
    local_318 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    local_310 = pre;
    local_230 = prim;
    do {
      lVar21 = 0;
      if (uVar64 != 0) {
        for (; (uVar64 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
        }
      }
      local_3a0 = (ulong)*(uint *)(local_230 + 2);
      local_2c8 = (ulong)*(uint *)(local_230 + lVar21 * 4 + 6);
      pGVar18 = (context->scene->geometries).items[local_3a0].ptr;
      uVar62 = (ulong)*(uint *)(*(long *)&pGVar18->field_0x58 +
                               local_2c8 *
                               pGVar18[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar146 = pGVar18->fnumTimeSegments;
      fVar71 = (pGVar18->time_range).lower;
      fVar105 = ((*(float *)(ray + k * 4 + 0x70) - fVar71) / ((pGVar18->time_range).upper - fVar71))
                * fVar146;
      fVar71 = floorf(fVar105);
      fVar146 = fVar146 + -1.0;
      if (fVar146 <= fVar71) {
        fVar71 = fVar146;
      }
      fVar146 = 0.0;
      if (0.0 <= fVar71) {
        fVar146 = fVar71;
      }
      _Var19 = pGVar18[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      pGVar59 = (Geometry *)((long)(int)fVar146 * 0x38);
      lVar21 = *(long *)((long)&pGVar59->device + _Var19);
      lVar60 = *(long *)((long)&pGVar59->modCounter_ + _Var19);
      lVar20 = *(long *)((long)&pGVar59->occlusionFilterN + _Var19);
      pfVar1 = (float *)(lVar60 + uVar62 * lVar20);
      pfVar2 = (float *)(lVar60 + (uVar62 + 1) * lVar20);
      pfVar3 = (float *)(lVar60 + (uVar62 + 2) * lVar20);
      fVar105 = fVar105 - fVar146;
      fVar146 = 1.0 - fVar105;
      pfVar4 = (float *)(lVar60 + lVar20 * (uVar62 + 3));
      lVar60 = *(long *)((long)&(pGVar59->super_RefCount)._vptr_RefCount + _Var19);
      pfVar5 = (float *)(lVar60 + lVar21 * uVar62);
      pfVar6 = (float *)(lVar60 + lVar21 * (uVar62 + 1));
      local_2b8 = *pfVar5 * fVar146 + *pfVar1 * fVar105;
      fStack_2b4 = pfVar5[1] * fVar146 + pfVar1[1] * fVar105;
      fStack_2b0 = pfVar5[2] * fVar146 + pfVar1[2] * fVar105;
      fStack_2ac = pfVar5[3] * fVar146 + pfVar1[3] * fVar105;
      fVar234 = *pfVar6 * fVar146 + *pfVar2 * fVar105;
      fVar235 = pfVar6[1] * fVar146 + pfVar2[1] * fVar105;
      fVar240 = pfVar6[2] * fVar146 + pfVar2[2] * fVar105;
      fStack_12c = pfVar6[3] * fVar146 + pfVar2[3] * fVar105;
      pfVar1 = (float *)(lVar60 + lVar21 * (uVar62 + 2));
      fVar247 = *pfVar1 * fVar146 + *pfVar3 * fVar105;
      fVar248 = pfVar1[1] * fVar146 + pfVar3[1] * fVar105;
      fVar284 = pfVar1[2] * fVar146 + pfVar3[2] * fVar105;
      local_258 = pfVar1[3] * fVar146 + pfVar3[3] * fVar105;
      pfVar1 = (float *)(lVar60 + lVar21 * (uVar62 + 3));
      fVar221 = fVar146 * *pfVar1 + fVar105 * *pfVar4;
      fVar223 = fVar146 * pfVar1[1] + fVar105 * pfVar4[1];
      fVar226 = fVar146 * pfVar1[2] + fVar105 * pfVar4[2];
      fStack_11c = fVar146 * pfVar1[3] + fVar105 * pfVar4[3];
      iVar17 = (int)pGVar18[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      fVar146 = *(float *)(ray + k * 4);
      fVar71 = *(float *)(ray + k * 4 + 0x10);
      fVar105 = *(float *)(ray + k * 4 + 0x20);
      fVar163 = local_2b8 - fVar146;
      fVar177 = fStack_2b4 - fVar71;
      fVar181 = fStack_2b0 - fVar105;
      fVar108 = (local_238->vx).field_0.m128[0];
      fVar113 = (local_238->vx).field_0.m128[1];
      fVar134 = (local_238->vx).field_0.m128[2];
      fVar136 = (local_238->vy).field_0.m128[0];
      fVar139 = (local_238->vy).field_0.m128[1];
      fVar145 = (local_238->vy).field_0.m128[2];
      fVar147 = (local_238->vz).field_0.m128[0];
      fVar158 = (local_238->vz).field_0.m128[1];
      fVar160 = (local_238->vz).field_0.m128[2];
      local_248 = fVar163 * fVar108 + fVar177 * fVar136 + fVar181 * fVar147;
      local_268 = fVar163 * fVar113 + fVar177 * fVar139 + fVar181 * fVar158;
      fVar181 = fVar163 * fVar134 + fVar177 * fVar145 + fVar181 * fVar160;
      fVar177 = fVar234 - fVar146;
      fVar188 = fVar235 - fVar71;
      fVar211 = fVar240 - fVar105;
      fVar163 = fVar177 * fVar108 + fVar188 * fVar136 + fVar211 * fVar147;
      local_338 = fVar177 * fVar113 + fVar188 * fVar139 + fVar211 * fVar158;
      fVar188 = fVar177 * fVar134 + fVar188 * fVar145 + fVar211 * fVar160;
      fVar211 = fVar247 - fVar146;
      fVar213 = fVar248 - fVar71;
      fVar216 = fVar284 - fVar105;
      fVar177 = fVar211 * fVar108 + fVar213 * fVar136 + fVar216 * fVar147;
      local_328 = fVar211 * fVar113 + fVar213 * fVar139 + fVar216 * fVar158;
      fVar211 = fVar211 * fVar134 + fVar213 * fVar145 + fVar216 * fVar160;
      fVar146 = fVar221 - fVar146;
      fVar71 = fVar223 - fVar71;
      fVar105 = fVar226 - fVar105;
      fVar108 = fVar146 * fVar108 + fVar71 * fVar136 + fVar105 * fVar147;
      local_298 = fVar146 * fVar113 + fVar71 * fVar139 + fVar105 * fVar158;
      fVar71 = fVar146 * fVar134 + fVar71 * fVar145 + fVar105 * fVar160;
      auVar255._0_8_ = CONCAT44(local_268,local_248) & 0x7fffffff7fffffff;
      auVar255._8_4_ = ABS(fVar181);
      auVar255._12_4_ = ABS(fStack_2ac);
      auVar167._0_8_ = CONCAT44(local_338,fVar163) & 0x7fffffff7fffffff;
      auVar167._8_4_ = ABS(fVar188);
      auVar167._12_4_ = ABS(fStack_12c);
      auVar141 = maxps(auVar255,auVar167);
      auVar206._0_8_ = CONCAT44(local_328,fVar177) & 0x7fffffff7fffffff;
      auVar206._8_4_ = ABS(fVar211);
      auVar206._12_4_ = ABS(local_258);
      auVar126._0_8_ = CONCAT44(local_298,fVar108) & 0x7fffffff7fffffff;
      auVar126._8_4_ = ABS(fVar71);
      auVar126._12_4_ = ABS(fStack_11c);
      auVar74 = maxps(auVar206,auVar126);
      auVar74 = maxps(auVar141,auVar74);
      fVar146 = auVar74._4_4_;
      if (auVar74._4_4_ <= auVar74._0_4_) {
        fVar146 = auVar74._0_4_;
      }
      auVar256._8_8_ = auVar74._8_8_;
      auVar256._0_8_ = auVar74._8_8_;
      fVar105 = (float)iVar17;
      local_2d8 = ZEXT416((uint)fVar105);
      if (auVar74._8_4_ <= fVar146) {
        auVar256._0_4_ = fVar146;
      }
      pRVar56 = (RTCIntersectArguments *)((long)iVar17 * 0x40);
      lVar21 = (long)iVar17 * 0x44;
      fVar113 = *(float *)(bspline_basis0 + lVar21 + 0x908);
      fVar134 = *(float *)(bspline_basis0 + lVar21 + 0x90c);
      fVar136 = *(float *)(bspline_basis0 + lVar21 + 0x910);
      fVar139 = *(float *)(bspline_basis0 + lVar21 + 0x914);
      fVar145 = *(float *)(bspline_basis0 + lVar21 + 0xd8c);
      fVar147 = *(float *)(bspline_basis0 + lVar21 + 0xd90);
      fVar158 = *(float *)(bspline_basis0 + lVar21 + 0xd94);
      fVar160 = *(float *)(bspline_basis0 + lVar21 + 0xd98);
      local_148 = fVar247;
      fStack_144 = fVar248;
      fStack_140 = fVar284;
      fStack_13c = local_258;
      local_128 = fVar221;
      fStack_124 = fVar223;
      fStack_120 = fVar226;
      fVar213 = *(float *)(bspline_basis0 + lVar21 + 0x484);
      fVar216 = *(float *)(bspline_basis0 + lVar21 + 0x488);
      fVar236 = *(float *)(bspline_basis0 + lVar21 + 0x48c);
      fVar238 = *(float *)(bspline_basis0 + lVar21 + 0x490);
      local_138 = fVar234;
      fStack_134 = fVar235;
      fStack_130 = fVar240;
      local_348 = *(float *)(bspline_basis0 + lVar21);
      fStack_344 = *(float *)(bspline_basis0 + lVar21 + 4);
      fStack_340 = *(float *)(bspline_basis0 + lVar21 + 8);
      fStack_33c = *(float *)(bspline_basis0 + lVar21 + 0xc);
      fVar217 = local_248 * local_348 + fVar163 * fVar213 + fVar177 * fVar113 + fVar108 * fVar145;
      fVar222 = local_248 * fStack_344 + fVar163 * fVar216 + fVar177 * fVar134 + fVar108 * fVar147;
      fVar224 = local_248 * fStack_340 + fVar163 * fVar236 + fVar177 * fVar136 + fVar108 * fVar158;
      fVar225 = local_248 * fStack_33c + fVar163 * fVar238 + fVar177 * fVar139 + fVar108 * fVar160;
      fVar189 = local_268 * local_348 +
                local_338 * fVar213 + local_328 * fVar113 + local_298 * fVar145;
      fVar212 = local_268 * fStack_344 +
                local_338 * fVar216 + local_328 * fVar134 + local_298 * fVar147;
      fVar214 = local_268 * fStack_340 +
                local_338 * fVar236 + local_328 * fVar136 + local_298 * fVar158;
      fVar215 = local_268 * fStack_33c +
                local_338 * fVar238 + local_328 * fVar139 + local_298 * fVar160;
      auVar278._0_4_ =
           fStack_2ac * local_348 +
           fStack_12c * fVar213 + local_258 * fVar113 + fStack_11c * fVar145;
      auVar278._4_4_ =
           fStack_2ac * fStack_344 +
           fStack_12c * fVar216 + local_258 * fVar134 + fStack_11c * fVar147;
      auVar278._8_4_ =
           fStack_2ac * fStack_340 +
           fStack_12c * fVar236 + local_258 * fVar136 + fStack_11c * fVar158;
      auVar278._12_4_ =
           fStack_2ac * fStack_33c +
           fStack_12c * fVar238 + local_258 * fVar139 + fStack_11c * fVar160;
      fVar239 = *(float *)(bspline_basis1 + lVar21 + 0xd8c);
      fVar249 = *(float *)(bspline_basis1 + lVar21 + 0xd90);
      fVar257 = *(float *)(bspline_basis1 + lVar21 + 0xd94);
      fVar259 = *(float *)(bspline_basis1 + lVar21 + 0xd98);
      fVar262 = *(float *)(bspline_basis1 + lVar21 + 0x908);
      fVar269 = *(float *)(bspline_basis1 + lVar21 + 0x90c);
      fVar270 = *(float *)(bspline_basis1 + lVar21 + 0x910);
      fVar271 = *(float *)(bspline_basis1 + lVar21 + 0x914);
      local_58 = fStack_11c;
      fStack_54 = fStack_11c;
      fStack_50 = fStack_11c;
      fStack_4c = fStack_11c;
      fVar272 = *(float *)(bspline_basis1 + lVar21 + 0x484);
      fVar281 = *(float *)(bspline_basis1 + lVar21 + 0x488);
      fVar282 = *(float *)(bspline_basis1 + lVar21 + 0x48c);
      fVar283 = *(float *)(bspline_basis1 + lVar21 + 0x490);
      local_158 = fStack_12c;
      fStack_154 = fStack_12c;
      fStack_150 = fStack_12c;
      fStack_14c = fStack_12c;
      fVar285 = *(float *)(bspline_basis1 + lVar21);
      fVar291 = *(float *)(bspline_basis1 + lVar21 + 4);
      fVar292 = *(float *)(bspline_basis1 + lVar21 + 8);
      fVar293 = *(float *)(bspline_basis1 + lVar21 + 0xc);
      fVar164 = local_248 * fVar285 + fVar163 * fVar272 + fVar177 * fVar262 + fVar108 * fVar239;
      fVar178 = local_248 * fVar291 + fVar163 * fVar281 + fVar177 * fVar269 + fVar108 * fVar249;
      fVar182 = local_248 * fVar292 + fVar163 * fVar282 + fVar177 * fVar270 + fVar108 * fVar257;
      fVar185 = local_248 * fVar293 + fVar163 * fVar283 + fVar177 * fVar271 + fVar108 * fVar259;
      fVar148 = local_268 * fVar285 +
                local_338 * fVar272 + local_328 * fVar262 + local_298 * fVar239;
      fVar159 = local_268 * fVar291 +
                local_338 * fVar281 + local_328 * fVar269 + local_298 * fVar249;
      fVar161 = local_268 * fVar292 +
                local_338 * fVar282 + local_328 * fVar270 + local_298 * fVar257;
      fVar162 = local_268 * fVar293 +
                local_338 * fVar283 + local_328 * fVar271 + local_298 * fVar259;
      local_168 = fStack_2ac;
      fStack_164 = fStack_2ac;
      fStack_160 = fStack_2ac;
      fStack_15c = fStack_2ac;
      auVar232._0_4_ =
           fStack_2ac * fVar285 + fStack_12c * fVar272 + local_258 * fVar262 + fStack_11c * fVar239;
      auVar232._4_4_ =
           fStack_2ac * fVar291 + fStack_12c * fVar281 + local_258 * fVar269 + fStack_11c * fVar249;
      auVar232._8_4_ =
           fStack_2ac * fVar292 + fStack_12c * fVar282 + local_258 * fVar270 + fStack_11c * fVar257;
      auVar232._12_4_ =
           fStack_2ac * fVar293 + fStack_12c * fVar283 + local_258 * fVar271 + fStack_11c * fVar259;
      fVar165 = fVar164 - fVar217;
      fVar179 = fVar178 - fVar222;
      fVar183 = fVar182 - fVar224;
      fVar186 = fVar185 - fVar225;
      fVar72 = fVar148 - fVar189;
      fVar106 = fVar159 - fVar212;
      fVar109 = fVar161 - fVar214;
      fVar111 = fVar162 - fVar215;
      fVar146 = fVar189 * fVar165 - fVar217 * fVar72;
      fVar303 = fVar212 * fVar179 - fVar222 * fVar106;
      fVar305 = fVar214 * fVar183 - fVar224 * fVar109;
      fVar307 = fVar215 * fVar186 - fVar225 * fVar111;
      auVar74 = maxps(auVar278,auVar232);
      bVar48 = fVar146 * fVar146 <=
               auVar74._0_4_ * auVar74._0_4_ * (fVar165 * fVar165 + fVar72 * fVar72) &&
               0.0 < fVar105;
      bVar49 = fVar303 * fVar303 <=
               auVar74._4_4_ * auVar74._4_4_ * (fVar179 * fVar179 + fVar106 * fVar106) &&
               1.0 < fVar105;
      bVar47 = fVar305 * fVar305 <=
               auVar74._8_4_ * auVar74._8_4_ * (fVar183 * fVar183 + fVar109 * fVar109) &&
               2.0 < fVar105;
      bVar63 = fVar307 * fVar307 <=
               auVar74._12_4_ * auVar74._12_4_ * (fVar186 * fVar186 + fVar111 * fVar111) &&
               3.0 < fVar105;
      local_388 = auVar256._0_4_;
      fStack_384 = auVar256._4_4_;
      fStack_380 = auVar256._8_4_;
      fStack_37c = auVar256._12_4_;
      local_388 = local_388 * 4.7683716e-07;
      auVar22._4_4_ = -(uint)bVar49;
      auVar22._0_4_ = -(uint)bVar48;
      auVar22._8_4_ = -(uint)bVar47;
      auVar22._12_4_ = -(uint)bVar63;
      iVar51 = movmskps(iVar17,auVar22);
      fVar146 = *(float *)(ray + k * 4 + 0x30);
      _local_2a8 = ZEXT416((uint)fVar146);
      fStack_334 = local_338;
      fStack_330 = local_338;
      fStack_32c = local_338;
      fStack_324 = local_328;
      fStack_320 = local_328;
      fStack_31c = local_328;
      fStack_294 = local_298;
      fStack_290 = local_298;
      fStack_28c = local_298;
      fStack_264 = local_268;
      fStack_260 = local_268;
      fStack_25c = local_268;
      fStack_254 = local_258;
      fStack_250 = local_258;
      fStack_24c = local_258;
      fStack_244 = local_248;
      fStack_240 = local_248;
      fStack_23c = local_248;
      if (iVar51 == 0) {
        bVar63 = false;
      }
      else {
        local_278._4_4_ = fVar106;
        local_278._0_4_ = fVar72;
        fStack_270 = fVar109;
        fStack_26c = fVar111;
        fVar73 = fVar239 * fVar71 + fVar262 * fVar211 + fVar272 * fVar188 + fVar285 * fVar181;
        fVar107 = fVar249 * fVar71 + fVar269 * fVar211 + fVar281 * fVar188 + fVar291 * fVar181;
        fVar110 = fVar257 * fVar71 + fVar270 * fVar211 + fVar282 * fVar188 + fVar292 * fVar181;
        fVar112 = fVar259 * fVar71 + fVar271 * fVar211 + fVar283 * fVar188 + fVar293 * fVar181;
        fVar114 = fVar145 * fVar71 + fVar113 * fVar211 + fVar213 * fVar188 + local_348 * fVar181;
        fVar135 = fVar147 * fVar71 + fVar134 * fVar211 + fVar216 * fVar188 + fStack_344 * fVar181;
        fVar137 = fVar158 * fVar71 + fVar136 * fVar211 + fVar236 * fVar188 + fStack_340 * fVar181;
        fVar138 = fVar160 * fVar71 + fVar139 * fVar211 + fVar238 * fVar188 + fStack_33c * fVar181;
        fVar113 = *(float *)(bspline_basis0 + lVar21 + 0x1210);
        fVar134 = *(float *)(bspline_basis0 + lVar21 + 0x1214);
        fVar136 = *(float *)(bspline_basis0 + lVar21 + 0x1218);
        fVar139 = *(float *)(bspline_basis0 + lVar21 + 0x121c);
        fVar145 = *(float *)(bspline_basis0 + lVar21 + 0x1694);
        fVar147 = *(float *)(bspline_basis0 + lVar21 + 0x1698);
        fVar158 = *(float *)(bspline_basis0 + lVar21 + 0x169c);
        fVar160 = *(float *)(bspline_basis0 + lVar21 + 0x16a0);
        fVar213 = *(float *)(bspline_basis0 + lVar21 + 0x1b18);
        fVar216 = *(float *)(bspline_basis0 + lVar21 + 0x1b1c);
        fVar236 = *(float *)(bspline_basis0 + lVar21 + 0x1b20);
        fVar238 = *(float *)(bspline_basis0 + lVar21 + 0x1b24);
        fVar239 = *(float *)(bspline_basis0 + lVar21 + 0x1f9c);
        fVar249 = *(float *)(bspline_basis0 + lVar21 + 0x1fa0);
        fVar257 = *(float *)(bspline_basis0 + lVar21 + 0x1fa4);
        fVar259 = *(float *)(bspline_basis0 + lVar21 + 0x1fa8);
        fVar250 = local_248 * fVar113 + fVar163 * fVar145 + fVar177 * fVar213 + fVar108 * fVar239;
        fVar258 = local_248 * fVar134 + fVar163 * fVar147 + fVar177 * fVar216 + fVar108 * fVar249;
        fVar260 = local_248 * fVar136 + fVar163 * fVar158 + fVar177 * fVar236 + fVar108 * fVar257;
        fVar261 = local_248 * fVar139 + fVar163 * fVar160 + fVar177 * fVar238 + fVar108 * fVar259;
        fVar302 = local_268 * fVar113 +
                  local_338 * fVar145 + local_328 * fVar213 + local_298 * fVar239;
        fVar304 = local_268 * fVar134 +
                  local_338 * fVar147 + local_328 * fVar216 + local_298 * fVar249;
        fVar306 = local_268 * fVar136 +
                  local_338 * fVar158 + local_328 * fVar236 + local_298 * fVar257;
        fVar308 = local_268 * fVar139 +
                  local_338 * fVar160 + local_328 * fVar238 + local_298 * fVar259;
        fVar262 = *(float *)(bspline_basis1 + lVar21 + 0x1210);
        fVar269 = *(float *)(bspline_basis1 + lVar21 + 0x1214);
        fVar270 = *(float *)(bspline_basis1 + lVar21 + 0x1218);
        fVar271 = *(float *)(bspline_basis1 + lVar21 + 0x121c);
        fVar272 = *(float *)(bspline_basis1 + lVar21 + 0x1b18);
        fVar281 = *(float *)(bspline_basis1 + lVar21 + 0x1b1c);
        fVar282 = *(float *)(bspline_basis1 + lVar21 + 0x1b20);
        fVar283 = *(float *)(bspline_basis1 + lVar21 + 0x1b24);
        fVar285 = *(float *)(bspline_basis1 + lVar21 + 0x1f9c);
        fVar291 = *(float *)(bspline_basis1 + lVar21 + 0x1fa0);
        fVar292 = *(float *)(bspline_basis1 + lVar21 + 0x1fa4);
        fVar293 = *(float *)(bspline_basis1 + lVar21 + 0x1fa8);
        fVar303 = *(float *)(bspline_basis1 + lVar21 + 0x1694);
        fVar305 = *(float *)(bspline_basis1 + lVar21 + 0x1698);
        fVar307 = *(float *)(bspline_basis1 + lVar21 + 0x169c);
        fVar294 = *(float *)(bspline_basis1 + lVar21 + 0x16a0);
        fVar295 = local_248 * fVar262 + fVar163 * fVar303 + fVar177 * fVar272 + fVar108 * fVar285;
        fVar299 = local_248 * fVar269 + fVar163 * fVar305 + fVar177 * fVar281 + fVar108 * fVar291;
        fVar300 = local_248 * fVar270 + fVar163 * fVar307 + fVar177 * fVar282 + fVar108 * fVar292;
        fVar301 = local_248 * fVar271 + fVar163 * fVar294 + fVar177 * fVar283 + fVar108 * fVar293;
        fVar166 = local_268 * fVar262 +
                  local_338 * fVar303 + local_328 * fVar272 + local_298 * fVar285;
        fVar180 = local_268 * fVar269 +
                  local_338 * fVar305 + local_328 * fVar281 + local_298 * fVar291;
        fVar184 = local_268 * fVar270 +
                  local_338 * fVar307 + local_328 * fVar282 + local_298 * fVar292;
        fVar187 = local_268 * fVar271 +
                  local_338 * fVar294 + local_328 * fVar283 + local_298 * fVar293;
        auVar279._0_8_ = CONCAT44(fVar258,fVar250) & 0x7fffffff7fffffff;
        auVar279._8_4_ = ABS(fVar260);
        auVar279._12_4_ = ABS(fVar261);
        auVar237._0_8_ = CONCAT44(fVar304,fVar302) & 0x7fffffff7fffffff;
        auVar237._8_4_ = ABS(fVar306);
        auVar237._12_4_ = ABS(fVar308);
        auVar74 = maxps(auVar279,auVar237);
        auVar286._0_8_ =
             CONCAT44(fVar134 * fVar181 + fVar147 * fVar188 + fVar216 * fVar211 + fVar249 * fVar71,
                      fVar113 * fVar181 + fVar145 * fVar188 + fVar213 * fVar211 + fVar239 * fVar71)
             & 0x7fffffff7fffffff;
        auVar286._8_4_ =
             ABS(fVar136 * fVar181 + fVar158 * fVar188 + fVar236 * fVar211 + fVar257 * fVar71);
        auVar286._12_4_ =
             ABS(fVar139 * fVar181 + fVar160 * fVar188 + fVar238 * fVar211 + fVar259 * fVar71);
        auVar74 = maxps(auVar74,auVar286);
        uVar65 = -(uint)(local_388 <= auVar74._0_4_);
        uVar66 = -(uint)(local_388 <= auVar74._4_4_);
        uVar67 = -(uint)(local_388 <= auVar74._8_4_);
        uVar68 = -(uint)(local_388 <= auVar74._12_4_);
        fVar213 = (float)((uint)fVar250 & uVar65 | ~uVar65 & (uint)fVar165);
        fVar216 = (float)((uint)fVar258 & uVar66 | ~uVar66 & (uint)fVar179);
        fVar236 = (float)((uint)fVar260 & uVar67 | ~uVar67 & (uint)fVar183);
        fVar238 = (float)((uint)fVar261 & uVar68 | ~uVar68 & (uint)fVar186);
        fVar239 = (float)(~uVar65 & (uint)fVar72 | (uint)fVar302 & uVar65);
        fVar249 = (float)(~uVar66 & (uint)fVar106 | (uint)fVar304 & uVar66);
        fVar257 = (float)(~uVar67 & (uint)fVar109 | (uint)fVar306 & uVar67);
        fVar259 = (float)(~uVar68 & (uint)fVar111 | (uint)fVar308 & uVar68);
        auVar287._0_8_ = CONCAT44(fVar299,fVar295) & 0x7fffffff7fffffff;
        auVar287._8_4_ = ABS(fVar300);
        auVar287._12_4_ = ABS(fVar301);
        auVar246._0_8_ = CONCAT44(fVar180,fVar166) & 0x7fffffff7fffffff;
        auVar246._8_4_ = ABS(fVar184);
        auVar246._12_4_ = ABS(fVar187);
        auVar74 = maxps(auVar287,auVar246);
        auVar219._0_8_ =
             CONCAT44(fVar269 * fVar181 + fVar305 * fVar188 + fVar281 * fVar211 + fVar291 * fVar71,
                      fVar262 * fVar181 + fVar303 * fVar188 + fVar272 * fVar211 + fVar285 * fVar71)
             & 0x7fffffff7fffffff;
        auVar219._8_4_ =
             ABS(fVar270 * fVar181 + fVar307 * fVar188 + fVar282 * fVar211 + fVar292 * fVar71);
        auVar219._12_4_ =
             ABS(fVar271 * fVar181 + fVar294 * fVar188 + fVar283 * fVar211 + fVar293 * fVar71);
        auVar74 = maxps(auVar74,auVar219);
        uVar65 = -(uint)(local_388 <= auVar74._0_4_);
        uVar66 = -(uint)(local_388 <= auVar74._4_4_);
        uVar67 = -(uint)(local_388 <= auVar74._8_4_);
        uVar68 = -(uint)(local_388 <= auVar74._12_4_);
        fVar272 = (float)((uint)fVar295 & uVar65 | ~uVar65 & (uint)fVar165);
        fVar281 = (float)((uint)fVar299 & uVar66 | ~uVar66 & (uint)fVar179);
        fVar282 = (float)((uint)fVar300 & uVar67 | ~uVar67 & (uint)fVar183);
        fVar283 = (float)((uint)fVar301 & uVar68 | ~uVar68 & (uint)fVar186);
        auVar168._0_4_ = (uint)fVar166 & uVar65;
        auVar168._4_4_ = (uint)fVar180 & uVar66;
        auVar168._8_4_ = (uint)fVar184 & uVar67;
        auVar168._12_4_ = (uint)fVar187 & uVar68;
        auVar288._0_4_ = ~uVar65 & (uint)fVar72;
        auVar288._4_4_ = ~uVar66 & (uint)fVar106;
        auVar288._8_4_ = ~uVar67 & (uint)fVar109;
        auVar288._12_4_ = ~uVar68 & (uint)fVar111;
        auVar288 = auVar288 | auVar168;
        auVar127._0_4_ = fVar239 * fVar239 + fVar213 * fVar213;
        auVar127._4_4_ = fVar249 * fVar249 + fVar216 * fVar216;
        auVar127._8_4_ = fVar257 * fVar257 + fVar236 * fVar236;
        auVar127._12_4_ = fVar259 * fVar259 + fVar238 * fVar238;
        auVar74 = rsqrtps(auVar168,auVar127);
        fVar113 = auVar74._0_4_;
        fVar134 = auVar74._4_4_;
        fVar136 = auVar74._8_4_;
        fVar139 = auVar74._12_4_;
        auVar169._0_4_ = fVar113 * fVar113 * auVar127._0_4_ * 0.5 * fVar113;
        auVar169._4_4_ = fVar134 * fVar134 * auVar127._4_4_ * 0.5 * fVar134;
        auVar169._8_4_ = fVar136 * fVar136 * auVar127._8_4_ * 0.5 * fVar136;
        auVar169._12_4_ = fVar139 * fVar139 * auVar127._12_4_ * 0.5 * fVar139;
        fVar285 = fVar113 * 1.5 - auVar169._0_4_;
        fVar291 = fVar134 * 1.5 - auVar169._4_4_;
        fVar292 = fVar136 * 1.5 - auVar169._8_4_;
        fVar293 = fVar139 * 1.5 - auVar169._12_4_;
        fVar262 = auVar288._0_4_;
        fVar269 = auVar288._4_4_;
        fVar270 = auVar288._8_4_;
        fVar271 = auVar288._12_4_;
        auVar128._0_4_ = fVar262 * fVar262 + fVar272 * fVar272;
        auVar128._4_4_ = fVar269 * fVar269 + fVar281 * fVar281;
        auVar128._8_4_ = fVar270 * fVar270 + fVar282 * fVar282;
        auVar128._12_4_ = fVar271 * fVar271 + fVar283 * fVar283;
        auVar74 = rsqrtps(auVar169,auVar128);
        fVar113 = auVar74._0_4_;
        fVar134 = auVar74._4_4_;
        fVar136 = auVar74._8_4_;
        fVar139 = auVar74._12_4_;
        fVar145 = fVar113 * 1.5 - fVar113 * fVar113 * auVar128._0_4_ * 0.5 * fVar113;
        fVar147 = fVar134 * 1.5 - fVar134 * fVar134 * auVar128._4_4_ * 0.5 * fVar134;
        fVar158 = fVar136 * 1.5 - fVar136 * fVar136 * auVar128._8_4_ * 0.5 * fVar136;
        fVar160 = fVar139 * 1.5 - fVar139 * fVar139 * auVar128._12_4_ * 0.5 * fVar139;
        fVar165 = fVar239 * fVar285 * auVar278._0_4_;
        fVar179 = fVar249 * fVar291 * auVar278._4_4_;
        fVar183 = fVar257 * fVar292 * auVar278._8_4_;
        fVar186 = fVar259 * fVar293 * auVar278._12_4_;
        fVar113 = -fVar213 * fVar285 * auVar278._0_4_;
        fVar134 = -fVar216 * fVar291 * auVar278._4_4_;
        fVar136 = -fVar236 * fVar292 * auVar278._8_4_;
        fVar139 = -fVar238 * fVar293 * auVar278._12_4_;
        local_348 = fVar189 + fVar113;
        fStack_344 = fVar212 + fVar134;
        fStack_340 = fVar214 + fVar136;
        fStack_33c = fVar215 + fVar139;
        fVar166 = fVar285 * 0.0 * auVar278._0_4_;
        fVar180 = fVar291 * 0.0 * auVar278._4_4_;
        fVar184 = fVar292 * 0.0 * auVar278._8_4_;
        fVar187 = fVar293 * 0.0 * auVar278._12_4_;
        fVar303 = fVar262 * fVar145 * auVar232._0_4_;
        fVar305 = fVar269 * fVar147 * auVar232._4_4_;
        fVar307 = fVar270 * fVar158 * auVar232._8_4_;
        fVar294 = fVar271 * fVar160 * auVar232._12_4_;
        fVar285 = fVar164 + fVar303;
        fVar291 = fVar178 + fVar305;
        fVar292 = fVar182 + fVar307;
        fVar293 = fVar185 + fVar294;
        fVar239 = -fVar272 * fVar145 * auVar232._0_4_;
        fVar249 = -fVar281 * fVar147 * auVar232._4_4_;
        fVar257 = -fVar282 * fVar158 * auVar232._8_4_;
        fVar259 = -fVar283 * fVar160 * auVar232._12_4_;
        fVar272 = fVar148 + fVar239;
        fVar281 = fVar159 + fVar249;
        fVar282 = fVar161 + fVar257;
        fVar283 = fVar162 + fVar259;
        fVar213 = fVar145 * 0.0 * auVar232._0_4_;
        fVar216 = fVar147 * 0.0 * auVar232._4_4_;
        fVar236 = fVar158 * 0.0 * auVar232._8_4_;
        fVar238 = fVar160 * 0.0 * auVar232._12_4_;
        fVar145 = fVar217 - fVar165;
        fVar147 = fVar222 - fVar179;
        fVar158 = fVar224 - fVar183;
        fVar160 = fVar225 - fVar186;
        fVar72 = fVar73 + fVar213;
        fVar106 = fVar107 + fVar216;
        fVar109 = fVar110 + fVar236;
        fVar111 = fVar112 + fVar238;
        fVar189 = fVar189 - fVar113;
        fVar212 = fVar212 - fVar134;
        fVar214 = fVar214 - fVar136;
        fVar215 = fVar215 - fVar139;
        fVar262 = fVar114 - fVar166;
        fVar269 = fVar135 - fVar180;
        fVar270 = fVar137 - fVar184;
        fVar271 = fVar138 - fVar187;
        uVar65 = -(uint)(0.0 < (fVar189 * (fVar72 - fVar262) - fVar262 * (fVar272 - fVar189)) * 0.0
                               + (fVar262 * (fVar285 - fVar145) - (fVar72 - fVar262) * fVar145) *
                                 0.0 + ((fVar272 - fVar189) * fVar145 -
                                       (fVar285 - fVar145) * fVar189));
        uVar66 = -(uint)(0.0 < (fVar212 * (fVar106 - fVar269) - fVar269 * (fVar281 - fVar212)) * 0.0
                               + (fVar269 * (fVar291 - fVar147) - (fVar106 - fVar269) * fVar147) *
                                 0.0 + ((fVar281 - fVar212) * fVar147 -
                                       (fVar291 - fVar147) * fVar212));
        uVar67 = -(uint)(0.0 < (fVar214 * (fVar109 - fVar270) - fVar270 * (fVar282 - fVar214)) * 0.0
                               + (fVar270 * (fVar292 - fVar158) - (fVar109 - fVar270) * fVar158) *
                                 0.0 + ((fVar282 - fVar214) * fVar158 -
                                       (fVar292 - fVar158) * fVar214));
        uVar68 = -(uint)(0.0 < (fVar215 * (fVar111 - fVar271) - fVar271 * (fVar283 - fVar215)) * 0.0
                               + (fVar271 * (fVar293 - fVar160) - (fVar111 - fVar271) * fVar160) *
                                 0.0 + ((fVar283 - fVar215) * fVar160 -
                                       (fVar293 - fVar160) * fVar215));
        fVar217 = (float)((uint)(fVar164 - fVar303) & uVar65 | ~uVar65 & (uint)(fVar217 + fVar165));
        fVar222 = (float)((uint)(fVar178 - fVar305) & uVar66 | ~uVar66 & (uint)(fVar222 + fVar179));
        fVar182 = (float)((uint)(fVar182 - fVar307) & uVar67 | ~uVar67 & (uint)(fVar224 + fVar183));
        fVar183 = (float)((uint)(fVar185 - fVar294) & uVar68 | ~uVar68 & (uint)(fVar225 + fVar186));
        fVar148 = (float)((uint)(fVar148 - fVar239) & uVar65 | ~uVar65 & (uint)local_348);
        fVar159 = (float)((uint)(fVar159 - fVar249) & uVar66 | ~uVar66 & (uint)fStack_344);
        fVar161 = (float)((uint)(fVar161 - fVar257) & uVar67 | ~uVar67 & (uint)fStack_340);
        fVar162 = (float)((uint)(fVar162 - fVar259) & uVar68 | ~uVar68 & (uint)fStack_33c);
        fVar213 = (float)((uint)(fVar73 - fVar213) & uVar65 | ~uVar65 & (uint)(fVar114 + fVar166));
        fVar216 = (float)((uint)(fVar107 - fVar216) & uVar66 | ~uVar66 & (uint)(fVar135 + fVar180));
        fVar236 = (float)((uint)(fVar110 - fVar236) & uVar67 | ~uVar67 & (uint)(fVar137 + fVar184));
        fVar238 = (float)((uint)(fVar112 - fVar238) & uVar68 | ~uVar68 & (uint)(fVar138 + fVar187));
        fVar239 = (float)((uint)fVar145 & uVar65 | ~uVar65 & (uint)fVar285);
        fVar249 = (float)((uint)fVar147 & uVar66 | ~uVar66 & (uint)fVar291);
        fVar257 = (float)((uint)fVar158 & uVar67 | ~uVar67 & (uint)fVar292);
        fVar259 = (float)((uint)fVar160 & uVar68 | ~uVar68 & (uint)fVar293);
        fVar113 = (float)((uint)fVar189 & uVar65 | ~uVar65 & (uint)fVar272);
        fVar134 = (float)((uint)fVar212 & uVar66 | ~uVar66 & (uint)fVar281);
        fVar136 = (float)((uint)fVar214 & uVar67 | ~uVar67 & (uint)fVar282);
        fVar139 = (float)((uint)fVar215 & uVar68 | ~uVar68 & (uint)fVar283);
        fVar164 = (float)((uint)fVar262 & uVar65 | ~uVar65 & (uint)fVar72);
        fVar165 = (float)((uint)fVar269 & uVar66 | ~uVar66 & (uint)fVar106);
        fVar178 = (float)((uint)fVar270 & uVar67 | ~uVar67 & (uint)fVar109);
        fVar179 = (float)((uint)fVar271 & uVar68 | ~uVar68 & (uint)fVar111);
        fVar285 = (float)((uint)fVar285 & uVar65 | ~uVar65 & (uint)fVar145) - fVar217;
        fVar291 = (float)((uint)fVar291 & uVar66 | ~uVar66 & (uint)fVar147) - fVar222;
        fVar292 = (float)((uint)fVar292 & uVar67 | ~uVar67 & (uint)fVar158) - fVar182;
        fVar293 = (float)((uint)fVar293 & uVar68 | ~uVar68 & (uint)fVar160) - fVar183;
        fVar272 = (float)((uint)fVar272 & uVar65 | ~uVar65 & (uint)fVar189) - fVar148;
        fVar281 = (float)((uint)fVar281 & uVar66 | ~uVar66 & (uint)fVar212) - fVar159;
        fVar282 = (float)((uint)fVar282 & uVar67 | ~uVar67 & (uint)fVar214) - fVar161;
        fVar283 = (float)((uint)fVar283 & uVar68 | ~uVar68 & (uint)fVar215) - fVar162;
        fVar72 = (float)((uint)fVar72 & uVar65 | ~uVar65 & (uint)fVar262) - fVar213;
        fVar189 = (float)((uint)fVar106 & uVar66 | ~uVar66 & (uint)fVar269) - fVar216;
        fVar106 = (float)((uint)fVar109 & uVar67 | ~uVar67 & (uint)fVar270) - fVar236;
        fVar212 = (float)((uint)fVar111 & uVar68 | ~uVar68 & (uint)fVar271) - fVar238;
        fVar185 = fVar217 - fVar239;
        fVar186 = fVar222 - fVar249;
        fVar224 = fVar182 - fVar257;
        fVar225 = fVar183 - fVar259;
        fVar262 = fVar148 - fVar113;
        fVar269 = fVar159 - fVar134;
        fVar270 = fVar161 - fVar136;
        fVar271 = fVar162 - fVar139;
        fVar145 = fVar213 - fVar164;
        fVar147 = fVar216 - fVar165;
        fVar158 = fVar236 - fVar178;
        fVar160 = fVar238 - fVar179;
        fVar109 = (fVar148 * fVar72 - fVar213 * fVar272) * 0.0 +
                  (fVar213 * fVar285 - fVar217 * fVar72) * 0.0 +
                  (fVar217 * fVar272 - fVar148 * fVar285);
        fVar214 = (fVar159 * fVar189 - fVar216 * fVar281) * 0.0 +
                  (fVar216 * fVar291 - fVar222 * fVar189) * 0.0 +
                  (fVar222 * fVar281 - fVar159 * fVar291);
        auVar154._4_4_ = fVar214;
        auVar154._0_4_ = fVar109;
        fVar111 = (fVar161 * fVar106 - fVar236 * fVar282) * 0.0 +
                  (fVar236 * fVar292 - fVar182 * fVar106) * 0.0 +
                  (fVar182 * fVar282 - fVar161 * fVar292);
        fVar215 = (fVar162 * fVar212 - fVar238 * fVar283) * 0.0 +
                  (fVar238 * fVar293 - fVar183 * fVar212) * 0.0 +
                  (fVar183 * fVar283 - fVar162 * fVar293);
        auVar296._0_4_ =
             (fVar113 * fVar145 - fVar164 * fVar262) * 0.0 +
             (fVar164 * fVar185 - fVar239 * fVar145) * 0.0 + (fVar239 * fVar262 - fVar113 * fVar185)
        ;
        auVar296._4_4_ =
             (fVar134 * fVar147 - fVar165 * fVar269) * 0.0 +
             (fVar165 * fVar186 - fVar249 * fVar147) * 0.0 + (fVar249 * fVar269 - fVar134 * fVar186)
        ;
        auVar296._8_4_ =
             (fVar136 * fVar158 - fVar178 * fVar270) * 0.0 +
             (fVar178 * fVar224 - fVar257 * fVar158) * 0.0 + (fVar257 * fVar270 - fVar136 * fVar224)
        ;
        auVar296._12_4_ =
             (fVar139 * fVar160 - fVar179 * fVar271) * 0.0 +
             (fVar179 * fVar225 - fVar259 * fVar160) * 0.0 + (fVar259 * fVar271 - fVar139 * fVar225)
        ;
        auVar154._8_4_ = fVar111;
        auVar154._12_4_ = fVar215;
        auVar74 = maxps(auVar154,auVar296);
        bVar48 = auVar74._0_4_ <= 0.0 && bVar48;
        auVar155._0_4_ = -(uint)bVar48;
        bVar49 = auVar74._4_4_ <= 0.0 && bVar49;
        auVar155._4_4_ = -(uint)bVar49;
        bVar47 = auVar74._8_4_ <= 0.0 && bVar47;
        auVar155._8_4_ = -(uint)bVar47;
        bVar63 = auVar74._12_4_ <= 0.0 && bVar63;
        auVar155._12_4_ = -(uint)bVar63;
        iVar51 = movmskps(iVar51,auVar155);
        if (iVar51 == 0) {
LAB_00beea3d:
          iVar51 = 0;
          auVar96._8_8_ = uStack_390;
          auVar96._0_8_ = local_398;
        }
        else {
          auVar170._0_4_ = fVar145 * fVar272;
          auVar170._4_4_ = fVar147 * fVar281;
          auVar170._8_4_ = fVar158 * fVar282;
          auVar170._12_4_ = fVar160 * fVar283;
          fVar239 = fVar262 * fVar72 - auVar170._0_4_;
          fVar249 = fVar269 * fVar189 - auVar170._4_4_;
          fVar257 = fVar270 * fVar106 - auVar170._8_4_;
          fVar259 = fVar271 * fVar212 - auVar170._12_4_;
          fVar113 = fVar145 * fVar285 - fVar72 * fVar185;
          fVar136 = fVar147 * fVar291 - fVar189 * fVar186;
          fVar145 = fVar158 * fVar292 - fVar106 * fVar224;
          fVar158 = fVar160 * fVar293 - fVar212 * fVar225;
          fVar262 = fVar185 * fVar272 - fVar262 * fVar285;
          fVar269 = fVar186 * fVar281 - fVar269 * fVar291;
          fVar270 = fVar224 * fVar282 - fVar270 * fVar292;
          fVar271 = fVar225 * fVar283 - fVar271 * fVar293;
          auVar207._0_4_ = fVar239 * 0.0 + fVar113 * 0.0 + fVar262;
          auVar207._4_4_ = fVar249 * 0.0 + fVar136 * 0.0 + fVar269;
          auVar207._8_4_ = fVar257 * 0.0 + fVar145 * 0.0 + fVar270;
          auVar207._12_4_ = fVar259 * 0.0 + fVar158 * 0.0 + fVar271;
          auVar74 = rcpps(auVar170,auVar207);
          fVar134 = auVar74._0_4_;
          fVar139 = auVar74._4_4_;
          fVar147 = auVar74._8_4_;
          fVar160 = auVar74._12_4_;
          fVar134 = (1.0 - auVar207._0_4_ * fVar134) * fVar134 + fVar134;
          fVar139 = (1.0 - auVar207._4_4_ * fVar139) * fVar139 + fVar139;
          fVar147 = (1.0 - auVar207._8_4_ * fVar147) * fVar147 + fVar147;
          fVar160 = (1.0 - auVar207._12_4_ * fVar160) * fVar160 + fVar160;
          fVar213 = (fVar213 * fVar262 + fVar148 * fVar113 + fVar217 * fVar239) * fVar134;
          fVar136 = (fVar216 * fVar269 + fVar159 * fVar136 + fVar222 * fVar249) * fVar139;
          fVar145 = (fVar236 * fVar270 + fVar161 * fVar145 + fVar182 * fVar257) * fVar147;
          fVar158 = (fVar238 * fVar271 + fVar162 * fVar158 + fVar183 * fVar259) * fVar160;
          fVar113 = *(float *)(ray + k * 4 + 0x80);
          bVar48 = (fVar213 <= fVar113 && fVar146 <= fVar213) && bVar48;
          auVar171._0_4_ = -(uint)bVar48;
          bVar49 = (fVar136 <= fVar113 && fVar146 <= fVar136) && bVar49;
          auVar171._4_4_ = -(uint)bVar49;
          bVar47 = (fVar145 <= fVar113 && fVar146 <= fVar145) && bVar47;
          auVar171._8_4_ = -(uint)bVar47;
          bVar63 = (fVar158 <= fVar113 && fVar146 <= fVar158) && bVar63;
          auVar171._12_4_ = -(uint)bVar63;
          iVar51 = movmskps(iVar51,auVar171);
          if (iVar51 == 0) goto LAB_00beea3d;
          auVar172._0_8_ =
               CONCAT44(-(uint)(auVar207._4_4_ != 0.0 && bVar49),
                        -(uint)(auVar207._0_4_ != 0.0 && bVar48));
          auVar172._8_4_ = -(uint)(auVar207._8_4_ != 0.0 && bVar47);
          auVar172._12_4_ = -(uint)(auVar207._12_4_ != 0.0 && bVar63);
          iVar51 = movmskps(iVar51,auVar172);
          auVar96._8_8_ = uStack_390;
          auVar96._0_8_ = local_398;
          if (iVar51 != 0) {
            fVar109 = fVar109 * fVar134;
            fVar214 = fVar214 * fVar139;
            fVar111 = fVar111 * fVar147;
            fVar215 = fVar215 * fVar160;
            local_3e8 = (float)((uint)(1.0 - fVar109) & uVar65 | ~uVar65 & (uint)fVar109);
            fStack_3e4 = (float)((uint)(1.0 - fVar214) & uVar66 | ~uVar66 & (uint)fVar214);
            fStack_3e0 = (float)((uint)(1.0 - fVar111) & uVar67 | ~uVar67 & (uint)fVar111);
            fStack_3dc = (float)((uint)(1.0 - fVar215) & uVar68 | ~uVar68 & (uint)fVar215);
            local_288 = (float)(~uVar65 & (uint)(auVar296._0_4_ * fVar134) |
                               (uint)(1.0 - auVar296._0_4_ * fVar134) & uVar65);
            fStack_284 = (float)(~uVar66 & (uint)(auVar296._4_4_ * fVar139) |
                                (uint)(1.0 - auVar296._4_4_ * fVar139) & uVar66);
            fStack_280 = (float)(~uVar67 & (uint)(auVar296._8_4_ * fVar147) |
                                (uint)(1.0 - auVar296._8_4_ * fVar147) & uVar67);
            fStack_27c = (float)(~uVar68 & (uint)(auVar296._12_4_ * fVar160) |
                                (uint)(1.0 - auVar296._12_4_ * fVar160) & uVar68);
            auVar96._8_4_ = auVar172._8_4_;
            auVar96._0_8_ = auVar172._0_8_;
            auVar96._12_4_ = auVar172._12_4_;
            local_3f8 = fVar213;
            fStack_3f4 = fVar136;
            fStack_3f0 = fVar145;
            fStack_3ec = fVar158;
          }
        }
        iVar51 = movmskps(iVar51,auVar96);
        if (iVar51 == 0) {
          bVar63 = false;
        }
        else {
          fVar113 = (auVar232._0_4_ - auVar278._0_4_) * local_3e8 + auVar278._0_4_;
          fVar134 = (auVar232._4_4_ - auVar278._4_4_) * fStack_3e4 + auVar278._4_4_;
          fVar136 = (auVar232._8_4_ - auVar278._8_4_) * fStack_3e0 + auVar278._8_4_;
          fVar139 = (auVar232._12_4_ - auVar278._12_4_) * fStack_3dc + auVar278._12_4_;
          fVar146 = *(float *)((long)local_310->ray_space + k * 4 + -0x10);
          auVar129._0_4_ = -(uint)(fVar146 * (fVar113 + fVar113) < local_3f8) & auVar96._0_4_;
          auVar129._4_4_ = -(uint)(fVar146 * (fVar134 + fVar134) < fStack_3f4) & auVar96._4_4_;
          auVar129._8_4_ = -(uint)(fVar146 * (fVar136 + fVar136) < fStack_3f0) & auVar96._8_4_;
          auVar129._12_4_ = -(uint)(fVar146 * (fVar139 + fVar139) < fStack_3ec) & auVar96._12_4_;
          uVar65 = movmskps((int)local_310,auVar129);
          if (uVar65 != 0) {
            local_288 = local_288 + local_288 + -1.0;
            fStack_284 = fStack_284 + fStack_284 + -1.0;
            fStack_280 = fStack_280 + fStack_280 + -1.0;
            fStack_27c = fStack_27c + fStack_27c + -1.0;
            local_1f8 = 0;
            local_1e8 = CONCAT44(fStack_2b4,local_2b8);
            uStack_1e0 = CONCAT44(fStack_2ac,fStack_2b0);
            local_1d8 = CONCAT44(fVar235,fVar234);
            uStack_1d0 = CONCAT44(fStack_12c,fVar240);
            local_1c8 = CONCAT44(fVar248,fVar247);
            uStack_1c0 = CONCAT44(local_258,fVar284);
            local_1b8 = CONCAT44(fVar223,fVar221);
            uStack_1b0 = CONCAT44(fStack_11c,fVar226);
            pRVar56 = (RTCIntersectArguments *)(ulong)*(uint *)(ray + k * 4 + 0x90);
            local_228 = local_3e8;
            fStack_224 = fStack_3e4;
            fStack_220 = fStack_3e0;
            fStack_21c = fStack_3dc;
            local_218 = local_288;
            fStack_214 = fStack_284;
            fStack_210 = fStack_280;
            fStack_20c = fStack_27c;
            local_208 = local_3f8;
            fStack_204 = fStack_3f4;
            fStack_200 = fStack_3f0;
            fStack_1fc = fStack_3ec;
            local_1f4 = iVar17;
            local_1a8 = auVar129;
            if ((pGVar18->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              pRVar56 = context->args;
              if ((pRVar56->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar63 = true, pGVar18->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar105 = 1.0 / fVar105;
                local_198[0] = fVar105 * (local_3e8 + 0.0);
                local_198[1] = fVar105 * (fStack_3e4 + 1.0);
                local_198[2] = fVar105 * (fStack_3e0 + 2.0);
                local_198[3] = fVar105 * (fStack_3dc + 3.0);
                local_188 = CONCAT44(fStack_284,local_288);
                uStack_180 = CONCAT44(fStack_27c,fStack_280);
                local_178[0] = local_3f8;
                local_178[1] = fStack_3f4;
                local_178[2] = fStack_3f0;
                local_178[3] = fStack_3ec;
                pGVar59 = (Geometry *)(ulong)(uVar65 & 0xff);
                uVar62 = 0;
                if (pGVar59 != (Geometry *)0x0) {
                  for (; ((uVar65 & 0xff) >> uVar62 & 1) == 0; uVar62 = uVar62 + 1) {
                  }
                }
                local_468 = CONCAT44((undefined4)local_3a0,(undefined4)local_3a0);
                uStack_460._0_4_ = (undefined4)local_3a0;
                uStack_460._4_4_ = (undefined4)local_3a0;
                local_458 = CONCAT44((undefined4)local_2c8,(undefined4)local_2c8);
                uStack_450._0_4_ = (undefined4)local_2c8;
                uStack_450._4_4_ = (undefined4)local_2c8;
                uVar23 = *local_318;
                uVar24 = local_318[1];
                bVar63 = true;
                do {
                  local_e8 = local_198[uVar62];
                  uVar55 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_d8 = *(undefined4 *)((long)&local_188 + uVar62 * 4);
                  *(float *)(ray + k * 4 + 0x80) = local_178[uVar62];
                  fVar134 = 1.0 - local_e8;
                  fVar146 = local_e8 * fVar134 * 4.0;
                  fVar136 = (fVar134 * fVar134 + fVar146) * 0.5;
                  fVar105 = local_e8 * local_e8 * 0.5;
                  fVar113 = (-local_e8 * local_e8 - fVar146) * 0.5;
                  local_308.context = context->user;
                  fVar146 = -fVar134 * fVar134 * 0.5;
                  local_118 = fVar146 * local_2b8 +
                              fVar113 * fVar234 + fVar136 * fVar247 + fVar105 * fVar221;
                  local_108 = fVar146 * fStack_2b4 +
                              fVar113 * fVar235 + fVar136 * fVar248 + fVar105 * fVar223;
                  local_f8 = fVar146 * fStack_2b0 +
                             fVar113 * fVar240 + fVar136 * fVar284 + fVar105 * fVar226;
                  fStack_114 = local_118;
                  fStack_110 = local_118;
                  fStack_10c = local_118;
                  fStack_104 = local_108;
                  fStack_100 = local_108;
                  fStack_fc = local_108;
                  fStack_f4 = local_f8;
                  fStack_f0 = local_f8;
                  fStack_ec = local_f8;
                  fStack_e4 = local_e8;
                  fStack_e0 = local_e8;
                  fStack_dc = local_e8;
                  uStack_d4 = local_d8;
                  uStack_d0 = local_d8;
                  uStack_cc = local_d8;
                  local_c8 = local_458;
                  uStack_c0 = uStack_450;
                  local_b8 = local_468;
                  uStack_b0 = uStack_460;
                  local_a8 = (local_308.context)->instID[0];
                  uStack_a4 = local_a8;
                  uStack_a0 = local_a8;
                  uStack_9c = local_a8;
                  local_98 = (local_308.context)->instPrimID[0];
                  uStack_94 = local_98;
                  uStack_90 = local_98;
                  uStack_8c = local_98;
                  local_308.valid = (int *)&local_3b8;
                  pRVar56 = (RTCIntersectArguments *)pGVar18->userPtr;
                  local_308.hit = (RTCHitN *)&local_118;
                  local_308.N = 4;
                  p_Var53 = pGVar18->occlusionFilterN;
                  local_3b8 = uVar23;
                  uStack_3b0 = uVar24;
                  local_308.geometryUserPtr = pRVar56;
                  local_308.ray = (RTCRayN *)ray;
                  if (p_Var53 != (RTCFilterFunctionN)0x0) {
                    p_Var53 = (RTCFilterFunctionN)(*p_Var53)(&local_308);
                  }
                  auVar97._0_4_ = -(uint)((int)local_3b8 == 0);
                  auVar97._4_4_ = -(uint)(local_3b8._4_4_ == 0);
                  auVar97._8_4_ = -(uint)((int)uStack_3b0 == 0);
                  auVar97._12_4_ = -(uint)(uStack_3b0._4_4_ == 0);
                  uVar65 = movmskps((int)p_Var53,auVar97);
                  pRVar54 = (RTCRayN *)(ulong)(uVar65 ^ 0xf);
                  if ((uVar65 ^ 0xf) == 0) {
                    auVar97 = auVar97 ^ _DAT_01febe20;
                  }
                  else {
                    pRVar56 = context->args;
                    if ((pRVar56->filter != (RTCFilterFunctionN)0x0) &&
                       (((pRVar56->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar18->field_8).field_0x2 & 0x40) != 0)))) {
                      (*pRVar56->filter)(&local_308);
                    }
                    auVar130._0_4_ = -(uint)((int)local_3b8 == 0);
                    auVar130._4_4_ = -(uint)(local_3b8._4_4_ == 0);
                    auVar130._8_4_ = -(uint)((int)uStack_3b0 == 0);
                    auVar130._12_4_ = -(uint)(uStack_3b0._4_4_ == 0);
                    auVar97 = auVar130 ^ _DAT_01febe20;
                    *(undefined1 (*) [16])(local_308.ray + 0x80) =
                         ~auVar130 & _DAT_01feba00 |
                         *(undefined1 (*) [16])(local_308.ray + 0x80) & auVar130;
                    pRVar54 = local_308.ray;
                  }
                  auVar98._0_4_ = auVar97._0_4_ << 0x1f;
                  auVar98._4_4_ = auVar97._4_4_ << 0x1f;
                  auVar98._8_4_ = auVar97._8_4_ << 0x1f;
                  auVar98._12_4_ = auVar97._12_4_ << 0x1f;
                  iVar51 = movmskps((int)pRVar54,auVar98);
                  if (iVar51 != 0) break;
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar55;
                  pGVar59 = (Geometry *)((ulong)pGVar59 ^ 1L << (uVar62 & 0x3f));
                  uVar62 = 0;
                  if (pGVar59 != (Geometry *)0x0) {
                    for (; ((ulong)pGVar59 >> uVar62 & 1) == 0; uVar62 = uVar62 + 1) {
                    }
                  }
                  bVar63 = pGVar59 != (Geometry *)0x0;
                } while (bVar63);
              }
              goto LAB_00beda96;
            }
          }
          bVar63 = false;
        }
      }
LAB_00beda96:
      uVar55 = SUB84(pRVar56,0);
      if (4 < iVar17) {
        local_68 = iVar17;
        iStack_64 = iVar17;
        iStack_60 = iVar17;
        iStack_5c = iVar17;
        local_2a8._4_4_ = local_2a8._0_4_;
        fStack_2a0 = (float)local_2a8._0_4_;
        fStack_29c = (float)local_2a8._0_4_;
        local_88 = 1.0 / (float)local_2d8._0_4_;
        fStack_84 = local_88;
        fStack_80 = local_88;
        fStack_7c = local_88;
        local_2d8._4_4_ = (undefined4)local_3a0;
        local_2d8._0_4_ = (undefined4)local_3a0;
        local_2d8._8_4_ = (undefined4)local_3a0;
        local_2d8._12_4_ = (undefined4)local_3a0;
        local_78 = (undefined4)local_2c8;
        uStack_74 = (undefined4)local_2c8;
        uStack_70 = (undefined4)local_2c8;
        uStack_6c = (undefined4)local_2c8;
        lVar60 = 4;
        fStack_384 = local_388;
        fStack_380 = local_388;
        fStack_37c = local_388;
        do {
          fVar291 = fStack_120;
          fVar285 = fStack_124;
          fVar283 = local_128;
          fVar282 = fStack_130;
          fVar281 = fStack_134;
          fVar272 = local_138;
          fVar271 = fStack_140;
          fVar270 = fStack_144;
          fVar269 = local_148;
          uVar66 = (uint)lVar60;
          puVar57 = bspline_basis0 + lVar21;
          pfVar1 = (float *)(puVar57 + lVar60 * 4);
          fVar146 = *pfVar1;
          fVar105 = pfVar1[1];
          fVar113 = pfVar1[2];
          fVar134 = pfVar1[3];
          pfVar1 = (float *)(lVar21 + 0x222bfac + lVar60 * 4);
          fVar136 = *pfVar1;
          fVar139 = pfVar1[1];
          fVar145 = pfVar1[2];
          fVar147 = pfVar1[3];
          pfVar1 = (float *)(lVar21 + 0x222c430 + lVar60 * 4);
          local_348 = *pfVar1;
          fStack_344 = pfVar1[1];
          fStack_340 = pfVar1[2];
          fStack_33c = pfVar1[3];
          pfVar1 = (float *)(lVar21 + 0x222c8b4 + lVar60 * 4);
          fVar158 = *pfVar1;
          fVar160 = pfVar1[1];
          fVar213 = pfVar1[2];
          fVar216 = pfVar1[3];
          fVar178 = local_248 * fVar146 +
                    fVar163 * fVar136 + fVar177 * local_348 + fVar108 * fVar158;
          fVar179 = fStack_244 * fVar105 +
                    fVar163 * fVar139 + fVar177 * fStack_344 + fVar108 * fVar160;
          fVar182 = fStack_240 * fVar113 +
                    fVar163 * fVar145 + fVar177 * fStack_340 + fVar108 * fVar213;
          fVar183 = fStack_23c * fVar134 +
                    fVar163 * fVar147 + fVar177 * fStack_33c + fVar108 * fVar216;
          fVar185 = local_268 * fVar146 +
                    local_338 * fVar136 + local_328 * local_348 + local_298 * fVar158;
          fVar217 = fStack_264 * fVar105 +
                    fStack_334 * fVar139 + fStack_324 * fStack_344 + fStack_294 * fVar160;
          fVar224 = fStack_260 * fVar113 +
                    fStack_330 * fVar145 + fStack_320 * fStack_340 + fStack_290 * fVar213;
          fVar303 = fStack_25c * fVar134 +
                    fStack_32c * fVar147 + fStack_31c * fStack_33c + fStack_28c * fVar216;
          auVar132._0_4_ =
               local_168 * fVar146 +
               local_158 * fVar136 + local_258 * local_348 + local_58 * fVar158;
          auVar132._4_4_ =
               fStack_164 * fVar105 +
               fStack_154 * fVar139 + fStack_254 * fStack_344 + fStack_54 * fVar160;
          auVar132._8_4_ =
               fStack_160 * fVar113 +
               fStack_150 * fVar145 + fStack_250 * fStack_340 + fStack_50 * fVar213;
          auVar132._12_4_ =
               fStack_15c * fVar134 +
               fStack_14c * fVar147 + fStack_24c * fStack_33c + fStack_4c * fVar216;
          pfVar1 = (float *)(bspline_basis1 + lVar21 + lVar60 * 4);
          fVar221 = *pfVar1;
          fVar223 = pfVar1[1];
          fVar226 = pfVar1[2];
          fVar234 = pfVar1[3];
          pfVar1 = (float *)(lVar21 + 0x222e3cc + lVar60 * 4);
          fVar235 = *pfVar1;
          fVar240 = pfVar1[1];
          fVar247 = pfVar1[2];
          fVar248 = pfVar1[3];
          pfVar1 = (float *)(lVar21 + 0x222e850 + lVar60 * 4);
          fVar284 = *pfVar1;
          fVar236 = pfVar1[1];
          fVar238 = pfVar1[2];
          fVar239 = pfVar1[3];
          pfVar1 = (float *)(lVar21 + 0x222ecd4 + lVar60 * 4);
          fVar249 = *pfVar1;
          fVar257 = pfVar1[1];
          fVar259 = pfVar1[2];
          fVar262 = pfVar1[3];
          fVar106 = local_248 * fVar221 + fVar163 * fVar235 + fVar177 * fVar284 + fVar108 * fVar249;
          fVar109 = fStack_244 * fVar223 + fVar163 * fVar240 + fVar177 * fVar236 + fVar108 * fVar257
          ;
          fVar111 = fStack_240 * fVar226 + fVar163 * fVar247 + fVar177 * fVar238 + fVar108 * fVar259
          ;
          fVar148 = fStack_23c * fVar234 + fVar163 * fVar248 + fVar177 * fVar239 + fVar108 * fVar262
          ;
          fVar161 = local_268 * fVar221 +
                    local_338 * fVar235 + local_328 * fVar284 + local_298 * fVar249;
          fVar162 = fStack_264 * fVar223 +
                    fStack_334 * fVar240 + fStack_324 * fVar236 + fStack_294 * fVar257;
          fVar164 = fStack_260 * fVar226 +
                    fStack_330 * fVar247 + fStack_320 * fVar238 + fStack_290 * fVar259;
          fVar165 = fStack_25c * fVar234 +
                    fStack_32c * fVar248 + fStack_31c * fVar239 + fStack_28c * fVar262;
          auVar297._0_4_ =
               local_168 * fVar221 + local_158 * fVar235 + local_258 * fVar284 + local_58 * fVar249;
          auVar297._4_4_ =
               fStack_164 * fVar223 +
               fStack_154 * fVar240 + fStack_254 * fVar236 + fStack_54 * fVar257;
          auVar297._8_4_ =
               fStack_160 * fVar226 +
               fStack_150 * fVar247 + fStack_250 * fVar238 + fStack_50 * fVar259;
          auVar297._12_4_ =
               fStack_15c * fVar234 +
               fStack_14c * fVar248 + fStack_24c * fVar239 + fStack_4c * fVar262;
          fVar212 = fVar106 - fVar178;
          fVar214 = fVar109 - fVar179;
          fVar215 = fVar111 - fVar182;
          fVar159 = fVar148 - fVar183;
          fVar292 = fVar161 - fVar185;
          fVar293 = fVar162 - fVar217;
          fVar72 = fVar164 - fVar224;
          fVar189 = fVar165 - fVar303;
          fVar186 = fVar185 * fVar212 - fVar178 * fVar292;
          fVar222 = fVar217 * fVar214 - fVar179 * fVar293;
          fVar225 = fVar224 * fVar215 - fVar182 * fVar72;
          fVar305 = fVar303 * fVar159 - fVar183 * fVar189;
          auVar74 = maxps(auVar132,auVar297);
          bVar47 = fVar186 * fVar186 <=
                   auVar74._0_4_ * auVar74._0_4_ * (fVar212 * fVar212 + fVar292 * fVar292) &&
                   (int)uVar66 < local_68;
          auVar233._0_4_ = -(uint)bVar47;
          bVar48 = fVar222 * fVar222 <=
                   auVar74._4_4_ * auVar74._4_4_ * (fVar214 * fVar214 + fVar293 * fVar293) &&
                   (int)(uVar66 | 1) < iStack_64;
          auVar233._4_4_ = -(uint)bVar48;
          bVar49 = fVar225 * fVar225 <=
                   auVar74._8_4_ * auVar74._8_4_ * (fVar215 * fVar215 + fVar72 * fVar72) &&
                   (int)(uVar66 | 2) < iStack_60;
          auVar233._8_4_ = -(uint)bVar49;
          bVar50 = fVar305 * fVar305 <=
                   auVar74._12_4_ * auVar74._12_4_ * (fVar159 * fVar159 + fVar189 * fVar189) &&
                   (int)(uVar66 | 3) < iStack_5c;
          auVar233._12_4_ = -(uint)bVar50;
          uVar65 = movmskps((int)pGVar59,auVar233);
          pGVar59 = (Geometry *)(ulong)uVar65;
          if (uVar65 != 0) {
            local_2c8 = CONCAT44(fVar214,fVar212);
            fVar307 = fVar249 * fVar71 + fVar284 * fVar211 + fVar235 * fVar188 + fVar221 * fVar181;
            fVar294 = fVar257 * fVar71 + fVar236 * fVar211 + fVar240 * fVar188 + fVar223 * fVar181;
            fVar73 = fVar259 * fVar71 + fVar238 * fVar211 + fVar247 * fVar188 + fVar226 * fVar181;
            fVar107 = fVar262 * fVar71 + fVar239 * fVar211 + fVar248 * fVar188 + fVar234 * fVar181;
            fVar137 = fVar158 * fVar71 + local_348 * fVar211 + fVar136 * fVar188 + fVar146 * fVar181
            ;
            fVar138 = fVar160 * fVar71 + fStack_344 * fVar211 + fVar139 * fVar188 +
                      fVar105 * fVar181;
            fVar166 = fVar213 * fVar71 + fStack_340 * fVar211 + fVar145 * fVar188 +
                      fVar113 * fVar181;
            fVar180 = fVar216 * fVar71 + fStack_33c * fVar211 + fVar147 * fVar188 +
                      fVar134 * fVar181;
            pfVar1 = (float *)(lVar21 + 0x222cd38 + lVar60 * 4);
            fVar146 = *pfVar1;
            fVar105 = pfVar1[1];
            fVar113 = pfVar1[2];
            fVar134 = pfVar1[3];
            pfVar1 = (float *)(lVar21 + 0x222d1bc + lVar60 * 4);
            fVar136 = *pfVar1;
            fVar139 = pfVar1[1];
            fVar145 = pfVar1[2];
            fVar147 = pfVar1[3];
            pfVar1 = (float *)(lVar21 + 0x222d640 + lVar60 * 4);
            fVar158 = *pfVar1;
            fVar160 = pfVar1[1];
            fVar213 = pfVar1[2];
            fVar216 = pfVar1[3];
            pfVar1 = (float *)(lVar21 + 0x222dac4 + lVar60 * 4);
            fVar221 = *pfVar1;
            fVar223 = pfVar1[1];
            fVar226 = pfVar1[2];
            fVar234 = pfVar1[3];
            fVar260 = local_248 * fVar146 +
                      fVar163 * fVar136 + fVar177 * fVar158 + fVar108 * fVar221;
            fVar261 = fStack_244 * fVar105 +
                      fVar163 * fVar139 + fVar177 * fVar160 + fVar108 * fVar223;
            fVar295 = fStack_240 * fVar113 +
                      fVar163 * fVar145 + fVar177 * fVar213 + fVar108 * fVar226;
            fVar299 = fStack_23c * fVar134 +
                      fVar163 * fVar147 + fVar177 * fVar216 + fVar108 * fVar234;
            fVar110 = local_268 * fVar146 +
                      local_338 * fVar136 + local_328 * fVar158 + local_298 * fVar221;
            fVar112 = fStack_264 * fVar105 +
                      fStack_334 * fVar139 + fStack_324 * fVar160 + fStack_294 * fVar223;
            fVar114 = fStack_260 * fVar113 +
                      fStack_330 * fVar145 + fStack_320 * fVar213 + fStack_290 * fVar226;
            fVar135 = fStack_25c * fVar134 +
                      fStack_32c * fVar147 + fStack_31c * fVar216 + fStack_28c * fVar234;
            pfVar1 = (float *)(lVar21 + 0x222f158 + lVar60 * 4);
            fVar235 = *pfVar1;
            fVar240 = pfVar1[1];
            fVar247 = pfVar1[2];
            fVar248 = pfVar1[3];
            pfVar1 = (float *)(lVar21 + 0x222fa60 + lVar60 * 4);
            fVar284 = *pfVar1;
            fVar236 = pfVar1[1];
            fVar238 = pfVar1[2];
            fVar239 = pfVar1[3];
            pfVar1 = (float *)(lVar21 + 0x222fee4 + lVar60 * 4);
            fVar249 = *pfVar1;
            fVar257 = pfVar1[1];
            fVar259 = pfVar1[2];
            fVar262 = pfVar1[3];
            pfVar1 = (float *)(lVar21 + 0x222f5dc + lVar60 * 4);
            fVar186 = *pfVar1;
            fVar222 = pfVar1[1];
            fVar225 = pfVar1[2];
            fVar305 = pfVar1[3];
            fVar300 = local_248 * fVar235 +
                      fVar163 * fVar186 + fVar177 * fVar284 + fVar108 * fVar249;
            fVar301 = fStack_244 * fVar240 +
                      fVar163 * fVar222 + fVar177 * fVar236 + fVar108 * fVar257;
            fVar302 = fStack_240 * fVar247 +
                      fVar163 * fVar225 + fVar177 * fVar238 + fVar108 * fVar259;
            fVar304 = fStack_23c * fVar248 +
                      fVar163 * fVar305 + fVar177 * fVar239 + fVar108 * fVar262;
            fVar184 = local_268 * fVar235 +
                      local_338 * fVar186 + local_328 * fVar284 + local_298 * fVar249;
            fVar187 = fStack_264 * fVar240 +
                      fStack_334 * fVar222 + fStack_324 * fVar236 + fStack_294 * fVar257;
            fVar250 = fStack_260 * fVar247 +
                      fStack_330 * fVar225 + fStack_320 * fVar238 + fStack_290 * fVar259;
            fVar258 = fStack_25c * fVar248 +
                      fStack_32c * fVar305 + fStack_31c * fVar239 + fStack_28c * fVar262;
            auVar280._0_8_ = CONCAT44(fVar261,fVar260) & 0x7fffffff7fffffff;
            auVar280._8_4_ = ABS(fVar295);
            auVar280._12_4_ = ABS(fVar299);
            auVar208._0_8_ = CONCAT44(fVar112,fVar110) & 0x7fffffff7fffffff;
            auVar208._8_4_ = ABS(fVar114);
            auVar208._12_4_ = ABS(fVar135);
            auVar74 = maxps(auVar280,auVar208);
            auVar289._0_8_ =
                 CONCAT44(fVar105 * fVar181 +
                          fVar139 * fVar188 + fVar160 * fVar211 + fVar223 * fVar71,
                          fVar146 * fVar181 +
                          fVar136 * fVar188 + fVar158 * fVar211 + fVar221 * fVar71) &
                 0x7fffffff7fffffff;
            auVar289._8_4_ =
                 ABS(fVar113 * fVar181 + fVar145 * fVar188 + fVar213 * fVar211 + fVar226 * fVar71);
            auVar289._12_4_ =
                 ABS(fVar134 * fVar181 + fVar147 * fVar188 + fVar216 * fVar211 + fVar234 * fVar71);
            auVar74 = maxps(auVar74,auVar289);
            uVar65 = -(uint)(local_388 <= auVar74._0_4_);
            uVar67 = -(uint)(fStack_384 <= auVar74._4_4_);
            uVar68 = -(uint)(fStack_380 <= auVar74._8_4_);
            uVar69 = -(uint)(fStack_37c <= auVar74._12_4_);
            auVar209._0_4_ = ~uVar65 & (uint)fVar212;
            auVar209._4_4_ = ~uVar67 & (uint)fVar214;
            auVar209._8_4_ = ~uVar68 & (uint)fVar215;
            auVar209._12_4_ = ~uVar69 & (uint)fVar159;
            auVar268._0_4_ = (uint)fVar260 & uVar65;
            auVar268._4_4_ = (uint)fVar261 & uVar67;
            auVar268._8_4_ = (uint)fVar295 & uVar68;
            auVar268._12_4_ = (uint)fVar299 & uVar69;
            auVar268 = auVar268 | auVar209;
            fVar110 = (float)(~uVar65 & (uint)fVar292 | (uint)fVar110 & uVar65);
            fVar112 = (float)(~uVar67 & (uint)fVar293 | (uint)fVar112 & uVar67);
            fVar114 = (float)(~uVar68 & (uint)fVar72 | (uint)fVar114 & uVar68);
            fVar135 = (float)(~uVar69 & (uint)fVar189 | (uint)fVar135 & uVar69);
            auVar290._0_8_ = CONCAT44(fVar301,fVar300) & 0x7fffffff7fffffff;
            auVar290._8_4_ = ABS(fVar302);
            auVar290._12_4_ = ABS(fVar304);
            auVar142._0_8_ = CONCAT44(fVar187,fVar184) & 0x7fffffff7fffffff;
            auVar142._8_4_ = ABS(fVar250);
            auVar142._12_4_ = ABS(fVar258);
            auVar74 = maxps(auVar290,auVar142);
            auVar99._0_8_ =
                 CONCAT44(fVar240 * fVar181 +
                          fVar222 * fVar188 + fVar236 * fVar211 + fVar257 * fVar71,
                          fVar235 * fVar181 +
                          fVar186 * fVar188 + fVar284 * fVar211 + fVar249 * fVar71) &
                 0x7fffffff7fffffff;
            auVar99._8_4_ =
                 ABS(fVar247 * fVar181 + fVar225 * fVar188 + fVar238 * fVar211 + fVar259 * fVar71);
            auVar99._12_4_ =
                 ABS(fVar248 * fVar181 + fVar305 * fVar188 + fVar239 * fVar211 + fVar262 * fVar71);
            auVar74 = maxps(auVar74,auVar99);
            uVar65 = -(uint)(local_388 <= auVar74._0_4_);
            uVar67 = -(uint)(fStack_384 <= auVar74._4_4_);
            uVar68 = -(uint)(fStack_380 <= auVar74._8_4_);
            uVar69 = -(uint)(fStack_37c <= auVar74._12_4_);
            fVar249 = (float)((uint)fVar300 & uVar65 | ~uVar65 & (uint)fVar212);
            fVar259 = (float)((uint)fVar301 & uVar67 | ~uVar67 & (uint)fVar214);
            fVar295 = (float)((uint)fVar302 & uVar68 | ~uVar68 & (uint)fVar215);
            fVar299 = (float)((uint)fVar304 & uVar69 | ~uVar69 & (uint)fVar159);
            fVar235 = (float)(~uVar65 & (uint)fVar292 | (uint)fVar184 & uVar65);
            fVar247 = (float)(~uVar67 & (uint)fVar293 | (uint)fVar187 & uVar67);
            fVar284 = (float)(~uVar68 & (uint)fVar72 | (uint)fVar250 & uVar68);
            fVar238 = (float)(~uVar69 & (uint)fVar189 | (uint)fVar258 & uVar69);
            fVar147 = auVar268._0_4_;
            fVar146 = auVar268._4_4_;
            fVar105 = auVar268._8_4_;
            fVar113 = auVar268._12_4_;
            auVar173._0_4_ = fVar110 * fVar110 + fVar147 * fVar147;
            auVar173._4_4_ = fVar112 * fVar112 + fVar146 * fVar146;
            auVar173._8_4_ = fVar114 * fVar114 + fVar105 * fVar105;
            auVar173._12_4_ = fVar135 * fVar135 + fVar113 * fVar113;
            auVar74 = rsqrtps(auVar209,auVar173);
            fVar134 = auVar74._0_4_;
            fVar136 = auVar74._4_4_;
            fVar139 = auVar74._8_4_;
            fVar145 = auVar74._12_4_;
            auVar210._0_4_ = fVar134 * fVar134 * auVar173._0_4_ * 0.5 * fVar134;
            auVar210._4_4_ = fVar136 * fVar136 * auVar173._4_4_ * 0.5 * fVar136;
            auVar210._8_4_ = fVar139 * fVar139 * auVar173._8_4_ * 0.5 * fVar139;
            auVar210._12_4_ = fVar145 * fVar145 * auVar173._12_4_ * 0.5 * fVar145;
            fVar221 = fVar134 * 1.5 - auVar210._0_4_;
            fVar223 = fVar136 * 1.5 - auVar210._4_4_;
            fVar226 = fVar139 * 1.5 - auVar210._8_4_;
            fVar234 = fVar145 * 1.5 - auVar210._12_4_;
            auVar174._0_4_ = fVar235 * fVar235 + fVar249 * fVar249;
            auVar174._4_4_ = fVar247 * fVar247 + fVar259 * fVar259;
            auVar174._8_4_ = fVar284 * fVar284 + fVar295 * fVar295;
            auVar174._12_4_ = fVar238 * fVar238 + fVar299 * fVar299;
            auVar74 = rsqrtps(auVar210,auVar174);
            fVar134 = auVar74._0_4_;
            fVar136 = auVar74._4_4_;
            fVar139 = auVar74._8_4_;
            fVar145 = auVar74._12_4_;
            fVar158 = fVar134 * 1.5 - fVar134 * fVar134 * auVar174._0_4_ * 0.5 * fVar134;
            fVar160 = fVar136 * 1.5 - fVar136 * fVar136 * auVar174._4_4_ * 0.5 * fVar136;
            fVar213 = fVar139 * 1.5 - fVar139 * fVar139 * auVar174._8_4_ * 0.5 * fVar139;
            fVar216 = fVar145 * 1.5 - fVar145 * fVar145 * auVar174._12_4_ * 0.5 * fVar145;
            fVar257 = fVar110 * fVar221 * auVar132._0_4_;
            fVar262 = fVar112 * fVar223 * auVar132._4_4_;
            fVar293 = fVar114 * fVar226 * auVar132._8_4_;
            fVar189 = fVar135 * fVar234 * auVar132._12_4_;
            fVar136 = -fVar147 * fVar221 * auVar132._0_4_;
            fVar139 = -fVar146 * fVar223 * auVar132._4_4_;
            fVar145 = -fVar105 * fVar226 * auVar132._8_4_;
            fVar147 = -fVar113 * fVar234 * auVar132._12_4_;
            fVar240 = fVar221 * 0.0 * auVar132._0_4_;
            fVar248 = fVar223 * 0.0 * auVar132._4_4_;
            fVar236 = fVar226 * 0.0 * auVar132._8_4_;
            fVar239 = fVar234 * 0.0 * auVar132._12_4_;
            fVar212 = fVar235 * fVar158 * auVar297._0_4_;
            fVar214 = fVar247 * fVar160 * auVar297._4_4_;
            fVar260 = fVar284 * fVar213 * auVar297._8_4_;
            fVar261 = fVar238 * fVar216 * auVar297._12_4_;
            fVar186 = fVar106 + fVar212;
            fVar222 = fVar109 + fVar214;
            fVar225 = fVar111 + fVar260;
            fVar305 = fVar148 + fVar261;
            fVar146 = -fVar249 * fVar158 * auVar297._0_4_;
            fVar105 = -fVar259 * fVar160 * auVar297._4_4_;
            fVar113 = -fVar295 * fVar213 * auVar297._8_4_;
            fVar134 = -fVar299 * fVar216 * auVar297._12_4_;
            fVar110 = fVar161 + fVar146;
            fVar112 = fVar162 + fVar105;
            fVar114 = fVar164 + fVar113;
            fVar135 = fVar165 + fVar134;
            fVar221 = fVar158 * 0.0 * auVar297._0_4_;
            fVar223 = fVar160 * 0.0 * auVar297._4_4_;
            fVar226 = fVar213 * 0.0 * auVar297._8_4_;
            fVar234 = fVar216 * 0.0 * auVar297._12_4_;
            fVar235 = fVar178 - fVar257;
            fVar247 = fVar179 - fVar262;
            fVar284 = fVar182 - fVar293;
            fVar238 = fVar183 - fVar189;
            fVar184 = fVar307 + fVar221;
            fVar187 = fVar294 + fVar223;
            fVar250 = fVar73 + fVar226;
            fVar258 = fVar107 + fVar234;
            fVar249 = fVar185 - fVar136;
            fVar259 = fVar217 - fVar139;
            fVar292 = fVar224 - fVar145;
            fVar72 = fVar303 - fVar147;
            fVar158 = fVar137 - fVar240;
            fVar160 = fVar138 - fVar248;
            fVar213 = fVar166 - fVar236;
            fVar216 = fVar180 - fVar239;
            uVar65 = -(uint)(0.0 < (fVar249 * (fVar184 - fVar158) - fVar158 * (fVar110 - fVar249)) *
                                   0.0 + (fVar158 * (fVar186 - fVar235) -
                                         (fVar184 - fVar158) * fVar235) * 0.0 +
                                         ((fVar110 - fVar249) * fVar235 -
                                         (fVar186 - fVar235) * fVar249));
            uVar67 = -(uint)(0.0 < (fVar259 * (fVar187 - fVar160) - fVar160 * (fVar112 - fVar259)) *
                                   0.0 + (fVar160 * (fVar222 - fVar247) -
                                         (fVar187 - fVar160) * fVar247) * 0.0 +
                                         ((fVar112 - fVar259) * fVar247 -
                                         (fVar222 - fVar247) * fVar259));
            uVar68 = -(uint)(0.0 < (fVar292 * (fVar250 - fVar213) - fVar213 * (fVar114 - fVar292)) *
                                   0.0 + (fVar213 * (fVar225 - fVar284) -
                                         (fVar250 - fVar213) * fVar284) * 0.0 +
                                         ((fVar114 - fVar292) * fVar284 -
                                         (fVar225 - fVar284) * fVar292));
            uVar69 = -(uint)(0.0 < (fVar72 * (fVar258 - fVar216) - fVar216 * (fVar135 - fVar72)) *
                                   0.0 + (fVar216 * (fVar305 - fVar238) -
                                         (fVar258 - fVar216) * fVar238) * 0.0 +
                                         ((fVar135 - fVar72) * fVar238 -
                                         (fVar305 - fVar238) * fVar72));
            fVar106 = (float)((uint)(fVar106 - fVar212) & uVar65 |
                             ~uVar65 & (uint)(fVar178 + fVar257));
            fVar212 = (float)((uint)(fVar109 - fVar214) & uVar67 |
                             ~uVar67 & (uint)(fVar179 + fVar262));
            fVar109 = (float)((uint)(fVar111 - fVar260) & uVar68 |
                             ~uVar68 & (uint)(fVar182 + fVar293));
            fVar214 = (float)((uint)(fVar148 - fVar261) & uVar69 |
                             ~uVar69 & (uint)(fVar183 + fVar189));
            fVar182 = (float)((uint)(fVar161 - fVar146) & uVar65 |
                             ~uVar65 & (uint)(fVar185 + fVar136));
            fVar183 = (float)((uint)(fVar162 - fVar105) & uVar67 |
                             ~uVar67 & (uint)(fVar217 + fVar139));
            fVar185 = (float)((uint)(fVar164 - fVar113) & uVar68 |
                             ~uVar68 & (uint)(fVar224 + fVar145));
            fVar217 = (float)((uint)(fVar165 - fVar134) & uVar69 |
                             ~uVar69 & (uint)(fVar303 + fVar147));
            fVar136 = (float)((uint)(fVar307 - fVar221) & uVar65 |
                             ~uVar65 & (uint)(fVar137 + fVar240));
            fVar139 = (float)((uint)(fVar294 - fVar223) & uVar67 |
                             ~uVar67 & (uint)(fVar138 + fVar248));
            fVar145 = (float)((uint)(fVar73 - fVar226) & uVar68 |
                             ~uVar68 & (uint)(fVar166 + fVar236));
            fVar147 = (float)((uint)(fVar107 - fVar234) & uVar69 |
                             ~uVar69 & (uint)(fVar180 + fVar239));
            fVar240 = (float)((uint)fVar235 & uVar65 | ~uVar65 & (uint)fVar186);
            fVar248 = (float)((uint)fVar247 & uVar67 | ~uVar67 & (uint)fVar222);
            fVar236 = (float)((uint)fVar284 & uVar68 | ~uVar68 & (uint)fVar225);
            fVar239 = (float)((uint)fVar238 & uVar69 | ~uVar69 & (uint)fVar305);
            fVar257 = (float)((uint)fVar249 & uVar65 | ~uVar65 & (uint)fVar110);
            fVar262 = (float)((uint)fVar259 & uVar67 | ~uVar67 & (uint)fVar112);
            fVar293 = (float)((uint)fVar292 & uVar68 | ~uVar68 & (uint)fVar114);
            fVar189 = (float)((uint)fVar72 & uVar69 | ~uVar69 & (uint)fVar135);
            fVar221 = (float)((uint)fVar158 & uVar65 | ~uVar65 & (uint)fVar184);
            fVar223 = (float)((uint)fVar160 & uVar67 | ~uVar67 & (uint)fVar187);
            fVar226 = (float)((uint)fVar213 & uVar68 | ~uVar68 & (uint)fVar250);
            fVar234 = (float)((uint)fVar216 & uVar69 | ~uVar69 & (uint)fVar258);
            fVar235 = (float)((uint)fVar186 & uVar65 | ~uVar65 & (uint)fVar235) - fVar106;
            fVar247 = (float)((uint)fVar222 & uVar67 | ~uVar67 & (uint)fVar247) - fVar212;
            fVar284 = (float)((uint)fVar225 & uVar68 | ~uVar68 & (uint)fVar284) - fVar109;
            fVar238 = (float)((uint)fVar305 & uVar69 | ~uVar69 & (uint)fVar238) - fVar214;
            fVar249 = (float)((uint)fVar110 & uVar65 | ~uVar65 & (uint)fVar249) - fVar182;
            fVar259 = (float)((uint)fVar112 & uVar67 | ~uVar67 & (uint)fVar259) - fVar183;
            fVar292 = (float)((uint)fVar114 & uVar68 | ~uVar68 & (uint)fVar292) - fVar185;
            fVar72 = (float)((uint)fVar135 & uVar69 | ~uVar69 & (uint)fVar72) - fVar217;
            fVar111 = (float)((uint)fVar184 & uVar65 | ~uVar65 & (uint)fVar158) - fVar136;
            fVar148 = (float)((uint)fVar187 & uVar67 | ~uVar67 & (uint)fVar160) - fVar139;
            fVar161 = (float)((uint)fVar250 & uVar68 | ~uVar68 & (uint)fVar213) - fVar145;
            fVar162 = (float)((uint)fVar258 & uVar69 | ~uVar69 & (uint)fVar216) - fVar147;
            fVar186 = fVar106 - fVar240;
            fVar222 = fVar212 - fVar248;
            fVar224 = fVar109 - fVar236;
            fVar225 = fVar214 - fVar239;
            fVar146 = fVar182 - fVar257;
            fVar105 = fVar183 - fVar262;
            fVar113 = fVar185 - fVar293;
            fVar134 = fVar217 - fVar189;
            fVar158 = fVar136 - fVar221;
            fVar160 = fVar139 - fVar223;
            fVar213 = fVar145 - fVar226;
            fVar216 = fVar147 - fVar234;
            fVar164 = (fVar182 * fVar111 - fVar136 * fVar249) * 0.0 +
                      (fVar136 * fVar235 - fVar106 * fVar111) * 0.0 +
                      (fVar106 * fVar249 - fVar182 * fVar235);
            fVar165 = (fVar183 * fVar148 - fVar139 * fVar259) * 0.0 +
                      (fVar139 * fVar247 - fVar212 * fVar148) * 0.0 +
                      (fVar212 * fVar259 - fVar183 * fVar247);
            auVar156._4_4_ = fVar165;
            auVar156._0_4_ = fVar164;
            fVar178 = (fVar185 * fVar161 - fVar145 * fVar292) * 0.0 +
                      (fVar145 * fVar284 - fVar109 * fVar161) * 0.0 +
                      (fVar109 * fVar292 - fVar185 * fVar284);
            fVar179 = (fVar217 * fVar162 - fVar147 * fVar72) * 0.0 +
                      (fVar147 * fVar238 - fVar214 * fVar162) * 0.0 +
                      (fVar214 * fVar72 - fVar217 * fVar238);
            auVar298._0_4_ =
                 (fVar257 * fVar158 - fVar221 * fVar146) * 0.0 +
                 (fVar221 * fVar186 - fVar240 * fVar158) * 0.0 +
                 (fVar240 * fVar146 - fVar257 * fVar186);
            auVar298._4_4_ =
                 (fVar262 * fVar160 - fVar223 * fVar105) * 0.0 +
                 (fVar223 * fVar222 - fVar248 * fVar160) * 0.0 +
                 (fVar248 * fVar105 - fVar262 * fVar222);
            auVar298._8_4_ =
                 (fVar293 * fVar213 - fVar226 * fVar113) * 0.0 +
                 (fVar226 * fVar224 - fVar236 * fVar213) * 0.0 +
                 (fVar236 * fVar113 - fVar293 * fVar224);
            auVar298._12_4_ =
                 (fVar189 * fVar216 - fVar234 * fVar134) * 0.0 +
                 (fVar234 * fVar225 - fVar239 * fVar216) * 0.0 +
                 (fVar239 * fVar134 - fVar189 * fVar225);
            auVar156._8_4_ = fVar178;
            auVar156._12_4_ = fVar179;
            auVar74 = maxps(auVar156,auVar298);
            bVar47 = auVar74._0_4_ <= 0.0 && bVar47;
            auVar157._0_4_ = -(uint)bVar47;
            bVar48 = auVar74._4_4_ <= 0.0 && bVar48;
            auVar157._4_4_ = -(uint)bVar48;
            bVar49 = auVar74._8_4_ <= 0.0 && bVar49;
            auVar157._8_4_ = -(uint)bVar49;
            bVar50 = auVar74._12_4_ <= 0.0 && bVar50;
            auVar157._12_4_ = -(uint)bVar50;
            iVar51 = movmskps((int)(bspline_basis1 + lVar21),auVar157);
            if (iVar51 == 0) {
              auVar144._8_8_ = uStack_390;
              auVar144._0_8_ = local_398;
              iVar51 = 0;
            }
            else {
              fVar223 = fVar146 * fVar111 - fVar158 * fVar249;
              fVar226 = fVar105 * fVar148 - fVar160 * fVar259;
              fVar234 = fVar113 * fVar161 - fVar213 * fVar292;
              fVar240 = fVar134 * fVar162 - fVar216 * fVar72;
              fVar221 = fVar158 * fVar235 - fVar111 * fVar186;
              fVar160 = fVar160 * fVar247 - fVar148 * fVar222;
              fVar213 = fVar213 * fVar284 - fVar161 * fVar224;
              fVar216 = fVar216 * fVar238 - fVar162 * fVar225;
              fVar146 = fVar186 * fVar249 - fVar146 * fVar235;
              fVar235 = fVar222 * fVar259 - fVar105 * fVar247;
              fVar247 = fVar224 * fVar292 - fVar113 * fVar284;
              fVar248 = fVar225 * fVar72 - fVar134 * fVar238;
              auVar143._0_4_ = fVar221 * 0.0 + fVar146;
              auVar143._4_4_ = fVar160 * 0.0 + fVar235;
              auVar143._8_4_ = fVar213 * 0.0 + fVar247;
              auVar143._12_4_ = fVar216 * 0.0 + fVar248;
              auVar220._0_4_ = fVar223 * 0.0 + auVar143._0_4_;
              auVar220._4_4_ = fVar226 * 0.0 + auVar143._4_4_;
              auVar220._8_4_ = fVar234 * 0.0 + auVar143._8_4_;
              auVar220._12_4_ = fVar240 * 0.0 + auVar143._12_4_;
              auVar74 = rcpps(auVar143,auVar220);
              fVar105 = auVar74._0_4_;
              fVar113 = auVar74._4_4_;
              fVar134 = auVar74._8_4_;
              fVar158 = auVar74._12_4_;
              fVar105 = (1.0 - auVar220._0_4_ * fVar105) * fVar105 + fVar105;
              fVar113 = (1.0 - auVar220._4_4_ * fVar113) * fVar113 + fVar113;
              fVar134 = (1.0 - auVar220._8_4_ * fVar134) * fVar134 + fVar134;
              fVar158 = (1.0 - auVar220._12_4_ * fVar158) * fVar158 + fVar158;
              fVar136 = (fVar136 * fVar146 + fVar182 * fVar221 + fVar106 * fVar223) * fVar105;
              fVar139 = (fVar139 * fVar235 + fVar183 * fVar160 + fVar212 * fVar226) * fVar113;
              fVar145 = (fVar145 * fVar247 + fVar185 * fVar213 + fVar109 * fVar234) * fVar134;
              fVar147 = (fVar147 * fVar248 + fVar217 * fVar216 + fVar214 * fVar240) * fVar158;
              fVar146 = *(float *)(ray + k * 4 + 0x80);
              bVar47 = (fVar136 <= fVar146 && (float)local_2a8._0_4_ <= fVar136) && bVar47;
              auVar175._0_4_ = -(uint)bVar47;
              bVar48 = (fVar139 <= fVar146 && (float)local_2a8._4_4_ <= fVar139) && bVar48;
              auVar175._4_4_ = -(uint)bVar48;
              bVar49 = (fVar145 <= fVar146 && fStack_2a0 <= fVar145) && bVar49;
              auVar175._8_4_ = -(uint)bVar49;
              bVar50 = (fVar147 <= fVar146 && fStack_29c <= fVar147) && bVar50;
              auVar175._12_4_ = -(uint)bVar50;
              iVar51 = movmskps(iVar51,auVar175);
              if (iVar51 == 0) {
                auVar144._8_8_ = uStack_390;
                auVar144._0_8_ = local_398;
                iVar51 = 0;
              }
              else {
                auVar176._0_8_ =
                     CONCAT44(-(uint)(auVar220._4_4_ != 0.0 && bVar48),
                              -(uint)(auVar220._0_4_ != 0.0 && bVar47));
                auVar176._8_4_ = -(uint)(auVar220._8_4_ != 0.0 && bVar49);
                auVar176._12_4_ = -(uint)(auVar220._12_4_ != 0.0 && bVar50);
                iVar51 = movmskps(iVar51,auVar176);
                auVar144._8_8_ = uStack_390;
                auVar144._0_8_ = local_398;
                if (iVar51 != 0) {
                  fVar164 = fVar164 * fVar105;
                  fVar165 = fVar165 * fVar113;
                  fVar178 = fVar178 * fVar134;
                  fVar179 = fVar179 * fVar158;
                  local_358 = (float)((uint)(1.0 - fVar164) & uVar65 | ~uVar65 & (uint)fVar164);
                  fStack_354 = (float)((uint)(1.0 - fVar165) & uVar67 | ~uVar67 & (uint)fVar165);
                  fStack_350 = (float)((uint)(1.0 - fVar178) & uVar68 | ~uVar68 & (uint)fVar178);
                  fStack_34c = (float)((uint)(1.0 - fVar179) & uVar69 | ~uVar69 & (uint)fVar179);
                  local_368 = (float)(~uVar65 & (uint)(auVar298._0_4_ * fVar105) |
                                     (uint)(1.0 - auVar298._0_4_ * fVar105) & uVar65);
                  fStack_364 = (float)(~uVar67 & (uint)(auVar298._4_4_ * fVar113) |
                                      (uint)(1.0 - auVar298._4_4_ * fVar113) & uVar67);
                  fStack_360 = (float)(~uVar68 & (uint)(auVar298._8_4_ * fVar134) |
                                      (uint)(1.0 - auVar298._8_4_ * fVar134) & uVar68);
                  fStack_35c = (float)(~uVar69 & (uint)(auVar298._12_4_ * fVar158) |
                                      (uint)(1.0 - auVar298._12_4_ * fVar158) & uVar69);
                  auVar144._8_4_ = auVar176._8_4_;
                  auVar144._0_8_ = auVar176._0_8_;
                  auVar144._12_4_ = auVar176._12_4_;
                  local_378 = fVar136;
                  fStack_374 = fVar139;
                  fStack_370 = fVar145;
                  fStack_36c = fVar147;
                }
              }
            }
            iVar51 = movmskps(iVar51,auVar144);
            fStack_2c0 = fVar215;
            fStack_2bc = fVar159;
            _local_278 = auVar233;
            if (iVar51 != 0) {
              fVar105 = (auVar297._0_4_ - auVar132._0_4_) * local_358 + auVar132._0_4_;
              fVar113 = (auVar297._4_4_ - auVar132._4_4_) * fStack_354 + auVar132._4_4_;
              fVar134 = (auVar297._8_4_ - auVar132._8_4_) * fStack_350 + auVar132._8_4_;
              fVar136 = (auVar297._12_4_ - auVar132._12_4_) * fStack_34c + auVar132._12_4_;
              fVar146 = *(float *)((long)local_310->ray_space + k * 4 + -0x10);
              auVar100._0_4_ = -(uint)(fVar146 * (fVar105 + fVar105) < local_378) & auVar144._0_4_;
              auVar100._4_4_ = -(uint)(fVar146 * (fVar113 + fVar113) < fStack_374) & auVar144._4_4_;
              auVar100._8_4_ = -(uint)(fVar146 * (fVar134 + fVar134) < fStack_370) & auVar144._8_4_;
              auVar100._12_4_ =
                   -(uint)(fVar146 * (fVar136 + fVar136) < fStack_36c) & auVar144._12_4_;
              uVar65 = movmskps((int)local_310,auVar100);
              if (uVar65 != 0) {
                local_368 = local_368 + local_368 + -1.0;
                fStack_364 = fStack_364 + fStack_364 + -1.0;
                fStack_360 = fStack_360 + fStack_360 + -1.0;
                fStack_35c = fStack_35c + fStack_35c + -1.0;
                local_1e8 = CONCAT44(fStack_2b4,local_2b8);
                uStack_1e0 = CONCAT44(fStack_2ac,fStack_2b0);
                local_1d8 = CONCAT44(fStack_134,local_138);
                uStack_1d0 = CONCAT44(fStack_12c,fStack_130);
                local_1c8 = CONCAT44(fStack_144,local_148);
                uStack_1c0 = CONCAT44(fStack_13c,fStack_140);
                local_1b8 = CONCAT44(fStack_124,local_128);
                uStack_1b0 = CONCAT44(fStack_11c,fStack_120);
                pGVar59 = (context->scene->geometries).items[local_3a0].ptr;
                local_228 = local_358;
                fStack_224 = fStack_354;
                fStack_220 = fStack_350;
                fStack_21c = fStack_34c;
                local_218 = local_368;
                fStack_214 = fStack_364;
                fStack_210 = fStack_360;
                fStack_20c = fStack_35c;
                local_208 = local_378;
                fStack_204 = fStack_374;
                fStack_200 = fStack_370;
                fStack_1fc = fStack_36c;
                local_1f8 = uVar66;
                local_1a8 = auVar100;
                if ((pGVar59->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  puVar57 = (undefined1 *)0x0;
                  local_1f4 = iVar17;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (puVar57 = (undefined1 *)CONCAT71((int7)((ulong)context->args >> 8),1),
                        local_1f4 = iVar17, pGVar59->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  fVar146 = (float)(int)uVar66;
                  local_198[0] = (fVar146 + local_358 + 0.0) * local_88;
                  local_198[1] = (fVar146 + fStack_354 + 1.0) * fStack_84;
                  local_198[2] = (fVar146 + fStack_350 + 2.0) * fStack_80;
                  local_198[3] = (fVar146 + fStack_34c + 3.0) * fStack_7c;
                  local_188 = CONCAT44(fStack_364,local_368);
                  uStack_180 = CONCAT44(fStack_35c,fStack_360);
                  local_178[0] = local_378;
                  local_178[1] = fStack_374;
                  local_178[2] = fStack_370;
                  local_178[3] = fStack_36c;
                  uVar61 = (ulong)(uVar65 & 0xff);
                  uVar62 = 0;
                  if (uVar61 != 0) {
                    for (; ((uVar65 & 0xff) >> uVar62 & 1) == 0; uVar62 = uVar62 + 1) {
                    }
                  }
                  uVar23 = *local_318;
                  uVar24 = local_318[1];
                  local_468._0_4_ = (uint)CONCAT71((int7)((ulong)local_318 >> 8),1);
                  local_1f4 = iVar17;
                  do {
                    local_e8 = local_198[uVar62];
                    uVar55 = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_d8 = *(undefined4 *)((long)&local_188 + uVar62 * 4);
                    *(float *)(ray + k * 4 + 0x80) = local_178[uVar62];
                    fVar134 = 1.0 - local_e8;
                    fVar146 = local_e8 * fVar134 * 4.0;
                    fVar136 = (fVar134 * fVar134 + fVar146) * 0.5;
                    fVar105 = local_e8 * local_e8 * 0.5;
                    fVar113 = (-local_e8 * local_e8 - fVar146) * 0.5;
                    local_308.context = context->user;
                    fVar146 = -fVar134 * fVar134 * 0.5;
                    local_118 = fVar146 * local_2b8 +
                                fVar113 * fVar272 + fVar136 * fVar269 + fVar105 * fVar283;
                    local_108 = fVar146 * fStack_2b4 +
                                fVar113 * fVar281 + fVar136 * fVar270 + fVar105 * fVar285;
                    local_f8 = fVar146 * fStack_2b0 +
                               fVar113 * fVar282 + fVar136 * fVar271 + fVar105 * fVar291;
                    fStack_114 = local_118;
                    fStack_110 = local_118;
                    fStack_10c = local_118;
                    fStack_104 = local_108;
                    fStack_100 = local_108;
                    fStack_fc = local_108;
                    fStack_f4 = local_f8;
                    fStack_f0 = local_f8;
                    fStack_ec = local_f8;
                    fStack_e4 = local_e8;
                    fStack_e0 = local_e8;
                    fStack_dc = local_e8;
                    uStack_d4 = local_d8;
                    uStack_d0 = local_d8;
                    uStack_cc = local_d8;
                    local_c8 = CONCAT44(uStack_74,local_78);
                    uStack_c0 = CONCAT44(uStack_6c,uStack_70);
                    local_b8 = local_2d8._0_8_;
                    uStack_b0 = local_2d8._8_8_;
                    local_a8 = (local_308.context)->instID[0];
                    uStack_a4 = local_a8;
                    uStack_a0 = local_a8;
                    uStack_9c = local_a8;
                    local_98 = (local_308.context)->instPrimID[0];
                    uStack_94 = local_98;
                    uStack_90 = local_98;
                    uStack_8c = local_98;
                    local_308.valid = (int *)&local_3b8;
                    local_308.geometryUserPtr = pGVar59->userPtr;
                    local_308.hit = (RTCHitN *)&local_118;
                    local_308.N = 4;
                    p_Var53 = pGVar59->occlusionFilterN;
                    local_3b8 = uVar23;
                    uStack_3b0 = uVar24;
                    local_308.ray = (RTCRayN *)ray;
                    if (p_Var53 != (RTCFilterFunctionN)0x0) {
                      p_Var53 = (RTCFilterFunctionN)(*p_Var53)(&local_308);
                    }
                    auVar101._0_4_ = -(uint)((int)local_3b8 == 0);
                    auVar101._4_4_ = -(uint)(local_3b8._4_4_ == 0);
                    auVar101._8_4_ = -(uint)((int)uStack_3b0 == 0);
                    auVar101._12_4_ = -(uint)(uStack_3b0._4_4_ == 0);
                    uVar65 = movmskps((int)p_Var53,auVar101);
                    pRVar54 = (RTCRayN *)(ulong)(uVar65 ^ 0xf);
                    if ((uVar65 ^ 0xf) == 0) {
                      auVar101 = auVar101 ^ _DAT_01febe20;
                    }
                    else {
                      p_Var53 = context->args->filter;
                      if ((p_Var53 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar59->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var53)(&local_308);
                      }
                      auVar133._0_4_ = -(uint)((int)local_3b8 == 0);
                      auVar133._4_4_ = -(uint)(local_3b8._4_4_ == 0);
                      auVar133._8_4_ = -(uint)((int)uStack_3b0 == 0);
                      auVar133._12_4_ = -(uint)(uStack_3b0._4_4_ == 0);
                      auVar101 = auVar133 ^ _DAT_01febe20;
                      *(undefined1 (*) [16])(local_308.ray + 0x80) =
                           ~auVar133 & _DAT_01feba00 |
                           *(undefined1 (*) [16])(local_308.ray + 0x80) & auVar133;
                      pRVar54 = local_308.ray;
                    }
                    auVar102._0_4_ = auVar101._0_4_ << 0x1f;
                    auVar102._4_4_ = auVar101._4_4_ << 0x1f;
                    auVar102._8_4_ = auVar101._8_4_ << 0x1f;
                    auVar102._12_4_ = auVar101._12_4_ << 0x1f;
                    iVar51 = movmskps((int)pRVar54,auVar102);
                    if (iVar51 != 0) break;
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar55;
                    uVar61 = uVar61 ^ 1L << (uVar62 & 0x3f);
                    uVar62 = 0;
                    if (uVar61 != 0) {
                      for (; (uVar61 >> uVar62 & 1) == 0; uVar62 = uVar62 + 1) {
                      }
                    }
                    local_468._0_4_ = (uint)(uVar61 != 0);
                  } while (uVar61 != 0);
                  puVar57 = (undefined1 *)(ulong)(uint)local_468;
                }
                bVar63 = (bool)(bVar63 | (byte)puVar57);
              }
            }
          }
          uVar55 = SUB84(puVar57,0);
          lVar60 = lVar60 + 4;
        } while ((int)lVar60 < iVar17);
      }
      if (bVar63 != false) {
        return local_4f9;
      }
      fVar146 = *(float *)(ray + k * 4 + 0x80);
      auVar131._4_4_ = -(uint)(fStack_44 <= fVar146);
      auVar131._0_4_ = -(uint)(local_48 <= fVar146);
      auVar131._8_4_ = -(uint)(fStack_40 <= fVar146);
      auVar131._12_4_ = -(uint)(fStack_3c <= fVar146);
      uVar65 = movmskps(uVar55,auVar131);
      uVar64 = uVar64 & uVar64 + 0xf & uVar65;
      local_4f9 = uVar64 != 0;
    } while (local_4f9);
  }
  return local_4f9;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }